

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_rgb.c
# Opt level: O0

void rgb32_yuv420_sse(uint32_t width,uint32_t height,uint8_t *RGBA,uint32_t RGBA_stride,uint8_t *Y,
                     uint8_t *U,uint8_t *V,uint32_t Y_stride,uint32_t UV_stride,YCbCrType yuv_type)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  RGB2YUVParam *pRVar27;
  ulong uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  undefined1 auVar65 [16];
  __m128i rgb8;
  __m128i rgb7;
  __m128i rgb6;
  __m128i rgb5;
  __m128i rgb4;
  __m128i rgb3;
  __m128i rgb2;
  __m128i rgb1;
  __m128i tmp8;
  __m128i tmp7;
  __m128i tmp6;
  __m128i tmp5;
  __m128i tmp4;
  __m128i tmp3;
  __m128i tmp2;
  __m128i tmp1;
  __m128i cr;
  __m128i cb;
  __m128i Y_1;
  __m128i cr2_16;
  __m128i cr1_16;
  __m128i cb2_16;
  __m128i cb1_16;
  __m128i y2_16;
  __m128i y1_16;
  __m128i b_16;
  __m128i g_16;
  __m128i r_16;
  uint8_t *local_2440;
  uint8_t *v_ptr;
  uint8_t *u_ptr;
  uint8_t *y_ptr2;
  uint8_t *y_ptr1;
  uint8_t *rgb_ptr2;
  uint8_t *rgb_ptr1;
  uint32_t y;
  uint32_t x;
  RGB2YUVParam *param;
  uint8_t *U_local;
  uint8_t *Y_local;
  uint32_t RGBA_stride_local;
  uint8_t *RGBA_local;
  uint32_t height_local;
  uint32_t width_local;
  byte local_2118;
  byte bStack_2117;
  byte bStack_2116;
  byte bStack_2114;
  byte bStack_2113;
  byte bStack_2112;
  byte local_2108;
  byte bStack_2107;
  byte bStack_2106;
  byte bStack_2104;
  byte bStack_2103;
  byte bStack_2102;
  byte local_20f8;
  byte bStack_20f7;
  byte bStack_20f6;
  byte bStack_20f4;
  byte bStack_20f3;
  byte bStack_20f2;
  byte local_20e8;
  byte bStack_20e7;
  byte bStack_20e6;
  byte bStack_20e4;
  byte bStack_20e3;
  byte bStack_20e2;
  byte local_20d8;
  byte bStack_20d7;
  byte bStack_20d6;
  byte bStack_20d4;
  byte bStack_20d3;
  byte bStack_20d2;
  byte local_20c8;
  byte bStack_20c7;
  byte bStack_20c6;
  byte bStack_20c4;
  byte bStack_20c3;
  byte bStack_20c2;
  byte local_20b8;
  byte bStack_20b7;
  byte bStack_20b6;
  byte bStack_20b4;
  byte bStack_20b3;
  byte bStack_20b2;
  byte local_20a8;
  byte bStack_20a7;
  byte bStack_20a6;
  byte bStack_20a4;
  byte bStack_20a3;
  byte bStack_20a2;
  byte local_1e58;
  byte bStack_1e57;
  byte bStack_1e56;
  byte bStack_1e54;
  byte bStack_1e53;
  byte bStack_1e52;
  byte local_1e48;
  byte bStack_1e47;
  byte bStack_1e46;
  byte bStack_1e44;
  byte bStack_1e43;
  byte bStack_1e42;
  byte local_1e38;
  byte bStack_1e37;
  byte bStack_1e36;
  byte bStack_1e34;
  byte bStack_1e33;
  byte bStack_1e32;
  byte local_1e28;
  byte bStack_1e27;
  byte bStack_1e26;
  byte bStack_1e24;
  byte bStack_1e23;
  byte bStack_1e22;
  byte local_1e18;
  byte bStack_1e17;
  byte bStack_1e16;
  byte bStack_1e14;
  byte bStack_1e13;
  byte bStack_1e12;
  byte local_1e08;
  byte bStack_1e07;
  byte bStack_1e06;
  byte bStack_1e04;
  byte bStack_1e03;
  byte bStack_1e02;
  byte local_1df8;
  byte bStack_1df7;
  byte bStack_1df6;
  byte bStack_1df4;
  byte bStack_1df3;
  byte bStack_1df2;
  byte local_1de8;
  byte bStack_1de7;
  byte bStack_1de6;
  byte bStack_1de4;
  byte bStack_1de3;
  byte bStack_1de2;
  byte bStack_1b50;
  byte bStack_1b4f;
  byte bStack_1b4e;
  byte bStack_1b4c;
  byte bStack_1b4b;
  byte bStack_1b4a;
  byte bStack_1b40;
  byte bStack_1b3f;
  byte bStack_1b3e;
  byte bStack_1b3c;
  byte bStack_1b3b;
  byte bStack_1b3a;
  byte bStack_1b30;
  byte bStack_1b2f;
  byte bStack_1b2e;
  byte bStack_1b2c;
  byte bStack_1b2b;
  byte bStack_1b2a;
  byte bStack_1b20;
  byte bStack_1b1f;
  byte bStack_1b1e;
  byte bStack_1b1c;
  byte bStack_1b1b;
  byte bStack_1b1a;
  byte bStack_1b10;
  byte bStack_1b0f;
  byte bStack_1b0e;
  byte bStack_1b0c;
  byte bStack_1b0b;
  byte bStack_1b0a;
  byte bStack_1b00;
  byte bStack_1aff;
  byte bStack_1afe;
  byte bStack_1afc;
  byte bStack_1afb;
  byte bStack_1afa;
  byte bStack_1af0;
  byte bStack_1aef;
  byte bStack_1aee;
  byte bStack_1aec;
  byte bStack_1aeb;
  byte bStack_1aea;
  byte bStack_1ae0;
  byte bStack_1adf;
  byte bStack_1ade;
  byte bStack_1adc;
  byte bStack_1adb;
  byte bStack_1ada;
  byte bStack_1850;
  byte bStack_184f;
  byte bStack_184e;
  byte bStack_184c;
  byte bStack_184b;
  byte bStack_184a;
  byte bStack_1840;
  byte bStack_183f;
  byte bStack_183e;
  byte bStack_183c;
  byte bStack_183b;
  byte bStack_183a;
  byte bStack_1830;
  byte bStack_182f;
  byte bStack_182e;
  byte bStack_182c;
  byte bStack_182b;
  byte bStack_182a;
  byte bStack_1820;
  byte bStack_181f;
  byte bStack_181e;
  byte bStack_181c;
  byte bStack_181b;
  byte bStack_181a;
  byte bStack_1810;
  byte bStack_180f;
  byte bStack_180e;
  byte bStack_180c;
  byte bStack_180b;
  byte bStack_180a;
  byte bStack_1800;
  byte bStack_17ff;
  byte bStack_17fe;
  byte bStack_17fc;
  byte bStack_17fb;
  byte bStack_17fa;
  byte bStack_17f0;
  byte bStack_17ef;
  byte bStack_17ee;
  byte bStack_17ec;
  byte bStack_17eb;
  byte bStack_17ea;
  byte bStack_17e0;
  byte bStack_17df;
  byte bStack_17de;
  byte bStack_17dc;
  byte bStack_17db;
  byte bStack_17da;
  short local_1648;
  short sStack_1646;
  short sStack_1644;
  short sStack_1642;
  short sStack_1640;
  short sStack_163e;
  short sStack_163c;
  short sStack_163a;
  short local_1628;
  short sStack_1626;
  short sStack_1624;
  short sStack_1622;
  short sStack_1620;
  short sStack_161e;
  short sStack_161c;
  short sStack_161a;
  ushort uStack_1616;
  ushort uStack_1614;
  ushort uStack_1612;
  ushort uStack_160e;
  ushort uStack_160c;
  ushort uStack_160a;
  ushort uStack_15f6;
  ushort uStack_15f4;
  ushort uStack_15f2;
  ushort uStack_15ee;
  ushort uStack_15ec;
  ushort uStack_15ea;
  ushort uStack_14d6;
  ushort uStack_14d4;
  ushort uStack_14d2;
  ushort uStack_14ce;
  ushort uStack_14cc;
  ushort uStack_14ca;
  ushort uStack_14b6;
  ushort uStack_14b4;
  ushort uStack_14b2;
  ushort uStack_14ae;
  ushort uStack_14ac;
  ushort uStack_14aa;
  short local_13c8;
  short sStack_13c6;
  short sStack_13c4;
  short sStack_13c2;
  short sStack_13c0;
  short sStack_13be;
  short sStack_13bc;
  short sStack_13ba;
  short local_13a8;
  short sStack_13a6;
  short sStack_13a4;
  short sStack_13a2;
  short sStack_13a0;
  short sStack_139e;
  short sStack_139c;
  short sStack_139a;
  ushort uStack_1396;
  ushort uStack_1394;
  ushort uStack_1392;
  ushort uStack_138e;
  ushort uStack_138c;
  ushort uStack_138a;
  ushort uStack_1376;
  ushort uStack_1374;
  ushort uStack_1372;
  ushort uStack_136e;
  ushort uStack_136c;
  ushort uStack_136a;
  ushort uStack_1256;
  ushort uStack_1254;
  ushort uStack_1252;
  ushort uStack_124e;
  ushort uStack_124c;
  ushort uStack_124a;
  ushort uStack_1236;
  ushort uStack_1234;
  ushort uStack_1232;
  ushort uStack_122e;
  ushort uStack_122c;
  ushort uStack_122a;
  ushort uStack_1156;
  ushort uStack_1154;
  ushort uStack_1152;
  ushort uStack_114e;
  ushort uStack_114c;
  ushort uStack_114a;
  short local_1148;
  short sStack_1146;
  short sStack_1144;
  short sStack_1142;
  short sStack_1140;
  short sStack_113e;
  short sStack_113c;
  short sStack_113a;
  ushort uStack_1136;
  ushort uStack_1134;
  ushort uStack_1132;
  ushort uStack_112e;
  ushort uStack_112c;
  ushort uStack_112a;
  short local_1128;
  short sStack_1126;
  short sStack_1124;
  short sStack_1122;
  short sStack_1120;
  short sStack_111e;
  short sStack_111c;
  short sStack_111a;
  ushort uStack_1116;
  ushort uStack_1114;
  ushort uStack_1112;
  ushort uStack_110e;
  ushort uStack_110c;
  ushort uStack_110a;
  ushort uStack_10f6;
  ushort uStack_10f4;
  ushort uStack_10f2;
  ushort uStack_10ee;
  ushort uStack_10ec;
  ushort uStack_10ea;
  ushort uStack_10d6;
  ushort uStack_10d4;
  ushort uStack_10d2;
  ushort uStack_10ce;
  ushort uStack_10cc;
  ushort uStack_10ca;
  ushort uStack_10c6;
  ushort uStack_10c4;
  ushort uStack_10c2;
  ushort uStack_10be;
  ushort uStack_10bc;
  ushort uStack_10ba;
  ushort uStack_10b6;
  ushort uStack_10b4;
  ushort uStack_10b2;
  ushort uStack_10ae;
  ushort uStack_10ac;
  ushort uStack_10aa;
  ushort uStack_10a6;
  ushort uStack_10a4;
  ushort uStack_10a2;
  ushort uStack_109e;
  ushort uStack_109c;
  ushort uStack_109a;
  ushort uStack_1096;
  ushort uStack_1094;
  ushort uStack_1092;
  ushort uStack_108e;
  ushort uStack_108c;
  ushort uStack_108a;
  ushort uStack_1086;
  ushort uStack_1084;
  ushort uStack_1082;
  ushort uStack_107e;
  ushort uStack_107c;
  ushort uStack_107a;
  ushort uStack_1076;
  ushort uStack_1074;
  ushort uStack_1072;
  ushort uStack_106e;
  ushort uStack_106c;
  ushort uStack_106a;
  ushort uStack_1066;
  ushort uStack_1064;
  ushort uStack_1062;
  ushort uStack_105e;
  ushort uStack_105c;
  ushort uStack_105a;
  ushort uStack_1056;
  ushort uStack_1054;
  ushort uStack_1052;
  ushort uStack_104e;
  ushort uStack_104c;
  ushort uStack_104a;
  ushort uStack_1046;
  ushort uStack_1044;
  ushort uStack_1042;
  ushort uStack_103e;
  ushort uStack_103c;
  ushort uStack_103a;
  ushort uStack_1036;
  ushort uStack_1034;
  ushort uStack_1032;
  ushort uStack_102e;
  ushort uStack_102c;
  ushort uStack_102a;
  ushort uStack_1026;
  ushort uStack_1024;
  ushort uStack_1022;
  ushort uStack_101e;
  ushort uStack_101c;
  ushort uStack_101a;
  ushort uStack_1016;
  ushort uStack_1014;
  ushort uStack_1012;
  ushort uStack_100e;
  ushort uStack_100c;
  ushort uStack_100a;
  ushort uStack_ff6;
  ushort uStack_ff4;
  ushort uStack_ff2;
  ushort uStack_fee;
  ushort uStack_fec;
  ushort uStack_fea;
  ushort uStack_fd6;
  ushort uStack_fd4;
  ushort uStack_fd2;
  ushort uStack_fce;
  ushort uStack_fcc;
  ushort uStack_fca;
  ushort uStack_fc6;
  ushort uStack_fc4;
  ushort uStack_fc2;
  ushort uStack_fbe;
  ushort uStack_fbc;
  ushort uStack_fba;
  ushort uStack_fb6;
  ushort uStack_fb4;
  ushort uStack_fb2;
  ushort uStack_fae;
  ushort uStack_fac;
  ushort uStack_faa;
  ushort uStack_fa6;
  ushort uStack_fa4;
  ushort uStack_fa2;
  ushort uStack_f9e;
  ushort uStack_f9c;
  ushort uStack_f9a;
  ushort uStack_f96;
  ushort uStack_f94;
  ushort uStack_f92;
  ushort uStack_f8e;
  ushort uStack_f8c;
  ushort uStack_f8a;
  ushort uStack_f86;
  ushort uStack_f84;
  ushort uStack_f82;
  ushort uStack_f7e;
  ushort uStack_f7c;
  ushort uStack_f7a;
  ushort uStack_f76;
  ushort uStack_f74;
  ushort uStack_f72;
  ushort uStack_f6e;
  ushort uStack_f6c;
  ushort uStack_f6a;
  ushort uStack_f66;
  ushort uStack_f64;
  ushort uStack_f62;
  ushort uStack_f5e;
  ushort uStack_f5c;
  ushort uStack_f5a;
  ushort uStack_f56;
  ushort uStack_f54;
  ushort uStack_f52;
  ushort uStack_f4e;
  ushort uStack_f4c;
  ushort uStack_f4a;
  ushort uStack_f46;
  ushort uStack_f44;
  ushort uStack_f42;
  ushort uStack_f3e;
  ushort uStack_f3c;
  ushort uStack_f3a;
  ushort uStack_f36;
  ushort uStack_f34;
  ushort uStack_f32;
  ushort uStack_f2e;
  ushort uStack_f2c;
  ushort uStack_f2a;
  ushort uStack_f26;
  ushort uStack_f24;
  ushort uStack_f22;
  ushort uStack_f1e;
  ushort uStack_f1c;
  ushort uStack_f1a;
  ushort uStack_f16;
  ushort uStack_f14;
  ushort uStack_f12;
  ushort uStack_f0e;
  ushort uStack_f0c;
  ushort uStack_f0a;
  short local_f08;
  short sStack_f06;
  short sStack_f04;
  short sStack_f02;
  short sStack_f00;
  short sStack_efe;
  short sStack_efc;
  short sStack_efa;
  ushort uStack_ef6;
  ushort uStack_ef4;
  ushort uStack_ef2;
  ushort uStack_eee;
  ushort uStack_eec;
  ushort uStack_eea;
  short local_ee8;
  short sStack_ee6;
  short sStack_ee4;
  short sStack_ee2;
  short sStack_ee0;
  short sStack_ede;
  short sStack_edc;
  short sStack_eda;
  ushort uStack_ed6;
  ushort uStack_ed4;
  ushort uStack_ed2;
  ushort uStack_ece;
  ushort uStack_ecc;
  ushort uStack_eca;
  ushort uStack_eb6;
  ushort uStack_eb4;
  ushort uStack_eb2;
  ushort uStack_eae;
  ushort uStack_eac;
  ushort uStack_eaa;
  ushort uStack_e96;
  ushort uStack_e94;
  ushort uStack_e92;
  ushort uStack_e8e;
  ushort uStack_e8c;
  ushort uStack_e8a;
  ushort uStack_e86;
  ushort uStack_e84;
  ushort uStack_e82;
  ushort uStack_e7e;
  ushort uStack_e7c;
  ushort uStack_e7a;
  ushort uStack_e76;
  ushort uStack_e74;
  ushort uStack_e72;
  ushort uStack_e6e;
  ushort uStack_e6c;
  ushort uStack_e6a;
  ushort uStack_e66;
  ushort uStack_e64;
  ushort uStack_e62;
  ushort uStack_e5e;
  ushort uStack_e5c;
  ushort uStack_e5a;
  ushort uStack_e56;
  ushort uStack_e54;
  ushort uStack_e52;
  ushort uStack_e4e;
  ushort uStack_e4c;
  ushort uStack_e4a;
  ushort uStack_e46;
  ushort uStack_e44;
  ushort uStack_e42;
  ushort uStack_e3e;
  ushort uStack_e3c;
  ushort uStack_e3a;
  ushort uStack_e36;
  ushort uStack_e34;
  ushort uStack_e32;
  ushort uStack_e2e;
  ushort uStack_e2c;
  ushort uStack_e2a;
  ushort uStack_e26;
  ushort uStack_e24;
  ushort uStack_e22;
  ushort uStack_e1e;
  ushort uStack_e1c;
  ushort uStack_e1a;
  ushort uStack_e16;
  ushort uStack_e14;
  ushort uStack_e12;
  ushort uStack_e0e;
  ushort uStack_e0c;
  ushort uStack_e0a;
  ushort uStack_e06;
  ushort uStack_e04;
  ushort uStack_e02;
  ushort uStack_dfe;
  ushort uStack_dfc;
  ushort uStack_dfa;
  ushort uStack_df6;
  ushort uStack_df4;
  ushort uStack_df2;
  ushort uStack_dee;
  ushort uStack_dec;
  ushort uStack_dea;
  ushort uStack_de6;
  ushort uStack_de4;
  ushort uStack_de2;
  ushort uStack_dde;
  ushort uStack_ddc;
  ushort uStack_dda;
  ushort uStack_dd6;
  ushort uStack_dd4;
  ushort uStack_dd2;
  ushort uStack_dce;
  ushort uStack_dcc;
  ushort uStack_dca;
  ushort uStack_db6;
  ushort uStack_db4;
  ushort uStack_db2;
  ushort uStack_dae;
  ushort uStack_dac;
  ushort uStack_daa;
  ushort uStack_d96;
  ushort uStack_d94;
  ushort uStack_d92;
  ushort uStack_d8e;
  ushort uStack_d8c;
  ushort uStack_d8a;
  ushort uStack_d86;
  ushort uStack_d84;
  ushort uStack_d82;
  ushort uStack_d7e;
  ushort uStack_d7c;
  ushort uStack_d7a;
  ushort uStack_d76;
  ushort uStack_d74;
  ushort uStack_d72;
  ushort uStack_d6e;
  ushort uStack_d6c;
  ushort uStack_d6a;
  ushort uStack_d66;
  ushort uStack_d64;
  ushort uStack_d62;
  ushort uStack_d5e;
  ushort uStack_d5c;
  ushort uStack_d5a;
  ushort uStack_d56;
  ushort uStack_d54;
  ushort uStack_d52;
  ushort uStack_d4e;
  ushort uStack_d4c;
  ushort uStack_d4a;
  ushort uStack_d46;
  ushort uStack_d44;
  ushort uStack_d42;
  ushort uStack_d3e;
  ushort uStack_d3c;
  ushort uStack_d3a;
  ushort uStack_d36;
  ushort uStack_d34;
  ushort uStack_d32;
  ushort uStack_d2e;
  ushort uStack_d2c;
  ushort uStack_d2a;
  ushort uStack_d26;
  ushort uStack_d24;
  ushort uStack_d22;
  ushort uStack_d1e;
  ushort uStack_d1c;
  ushort uStack_d1a;
  ushort uStack_d16;
  ushort uStack_d14;
  ushort uStack_d12;
  ushort uStack_d0e;
  ushort uStack_d0c;
  ushort uStack_d0a;
  ushort uStack_d06;
  ushort uStack_d04;
  ushort uStack_d02;
  ushort uStack_cfe;
  ushort uStack_cfc;
  ushort uStack_cfa;
  ushort uStack_cf6;
  ushort uStack_cf4;
  ushort uStack_cf2;
  ushort uStack_cee;
  ushort uStack_cec;
  ushort uStack_cea;
  ushort uStack_ce6;
  ushort uStack_ce4;
  ushort uStack_ce2;
  ushort uStack_cde;
  ushort uStack_cdc;
  ushort uStack_cda;
  ushort uStack_a66;
  ushort uStack_a64;
  ushort uStack_a62;
  ushort uStack_a5e;
  ushort uStack_a5c;
  ushort uStack_a5a;
  ushort uStack_a46;
  ushort uStack_a44;
  ushort uStack_a42;
  ushort uStack_a3e;
  ushort uStack_a3c;
  ushort uStack_a3a;
  ushort uStack_a26;
  ushort uStack_a24;
  ushort uStack_a22;
  ushort uStack_a1e;
  ushort uStack_a1c;
  ushort uStack_a1a;
  ushort uStack_a06;
  ushort uStack_a04;
  ushort uStack_a02;
  ushort uStack_9fe;
  ushort uStack_9fc;
  ushort uStack_9fa;
  ushort uStack_9e6;
  ushort uStack_9e4;
  ushort uStack_9e2;
  ushort uStack_9de;
  ushort uStack_9dc;
  ushort uStack_9da;
  ushort uStack_9c6;
  ushort uStack_9c4;
  ushort uStack_9c2;
  ushort uStack_9be;
  ushort uStack_9bc;
  ushort uStack_9ba;
  ushort uStack_9a6;
  ushort uStack_9a4;
  ushort uStack_9a2;
  ushort uStack_99e;
  ushort uStack_99c;
  ushort uStack_99a;
  ushort uStack_986;
  ushort uStack_984;
  ushort uStack_982;
  ushort uStack_97e;
  ushort uStack_97c;
  ushort uStack_97a;
  ushort uStack_966;
  ushort uStack_964;
  ushort uStack_962;
  ushort uStack_95e;
  ushort uStack_95c;
  ushort uStack_95a;
  ushort uStack_946;
  ushort uStack_944;
  ushort uStack_942;
  ushort uStack_93e;
  ushort uStack_93c;
  ushort uStack_93a;
  ushort uStack_926;
  ushort uStack_924;
  ushort uStack_922;
  ushort uStack_91e;
  ushort uStack_91c;
  ushort uStack_91a;
  ushort uStack_906;
  ushort uStack_904;
  ushort uStack_902;
  ushort uStack_8fe;
  ushort uStack_8fc;
  ushort uStack_8fa;
  ushort uStack_8e6;
  ushort uStack_8e4;
  ushort uStack_8e2;
  ushort uStack_8de;
  ushort uStack_8dc;
  ushort uStack_8da;
  ushort uStack_8c6;
  ushort uStack_8c4;
  ushort uStack_8c2;
  ushort uStack_8be;
  ushort uStack_8bc;
  ushort uStack_8ba;
  ushort uStack_8a6;
  ushort uStack_8a4;
  ushort uStack_8a2;
  ushort uStack_89e;
  ushort uStack_89c;
  ushort uStack_89a;
  ushort uStack_886;
  ushort uStack_884;
  ushort uStack_882;
  ushort uStack_87e;
  ushort uStack_87c;
  ushort uStack_87a;
  
  uVar28 = (ulong)yuv_type;
  pRVar27 = RGB2YUV + uVar28;
  for (rgb_ptr1._0_4_ = 0; (uint)rgb_ptr1 < height - 1; rgb_ptr1._0_4_ = (uint)rgb_ptr1 + 2) {
    rgb_ptr2 = RGBA + (uint)rgb_ptr1 * RGBA_stride;
    y_ptr1 = RGBA + ((uint)rgb_ptr1 + 1) * RGBA_stride;
    y_ptr2 = Y + (uint)rgb_ptr1 * Y_stride;
    u_ptr = Y + ((uint)rgb_ptr1 + 1) * Y_stride;
    v_ptr = U + ((uint)rgb_ptr1 >> 1) * UV_stride;
    local_2440 = V + ((uint)rgb_ptr1 >> 1) * UV_stride;
    for (rgb_ptr1._4_4_ = 0; rgb_ptr1._4_4_ < width - 0x1f; rgb_ptr1._4_4_ = rgb_ptr1._4_4_ + 0x20)
    {
      uVar4 = *(undefined8 *)rgb_ptr2;
      uVar5 = *(undefined8 *)(rgb_ptr2 + 8);
      uVar6 = *(undefined8 *)(rgb_ptr2 + 0x10);
      uVar7 = *(undefined8 *)(rgb_ptr2 + 0x18);
      uVar8 = *(undefined8 *)(rgb_ptr2 + 0x20);
      uVar9 = *(undefined8 *)(rgb_ptr2 + 0x28);
      uVar10 = *(undefined8 *)(rgb_ptr2 + 0x30);
      uVar11 = *(undefined8 *)(rgb_ptr2 + 0x38);
      uVar12 = *(undefined8 *)y_ptr1;
      uVar13 = *(undefined8 *)(y_ptr1 + 8);
      uVar14 = *(undefined8 *)(y_ptr1 + 0x10);
      uVar15 = *(undefined8 *)(y_ptr1 + 0x18);
      uVar16 = *(undefined8 *)(y_ptr1 + 0x20);
      uVar17 = *(undefined8 *)(y_ptr1 + 0x28);
      uVar18 = *(undefined8 *)(y_ptr1 + 0x30);
      uVar19 = *(undefined8 *)(y_ptr1 + 0x38);
      local_1de8 = (byte)uVar4;
      bStack_1de7 = (byte)((ulong)uVar4 >> 8);
      bStack_1de6 = (byte)((ulong)uVar4 >> 0x10);
      bStack_1de4 = (byte)((ulong)uVar4 >> 0x20);
      bStack_1de3 = (byte)((ulong)uVar4 >> 0x28);
      bStack_1de2 = (byte)((ulong)uVar4 >> 0x30);
      local_1df8 = (byte)uVar12;
      bStack_1df7 = (byte)((ulong)uVar12 >> 8);
      bStack_1df6 = (byte)((ulong)uVar12 >> 0x10);
      bStack_1df4 = (byte)((ulong)uVar12 >> 0x20);
      bStack_1df3 = (byte)((ulong)uVar12 >> 0x28);
      bStack_1df2 = (byte)((ulong)uVar12 >> 0x30);
      bStack_17e0 = (byte)uVar5;
      bStack_17df = (byte)((ulong)uVar5 >> 8);
      bStack_17de = (byte)((ulong)uVar5 >> 0x10);
      bStack_17dc = (byte)((ulong)uVar5 >> 0x20);
      bStack_17db = (byte)((ulong)uVar5 >> 0x28);
      bStack_17da = (byte)((ulong)uVar5 >> 0x30);
      bStack_17f0 = (byte)uVar13;
      bStack_17ef = (byte)((ulong)uVar13 >> 8);
      bStack_17ee = (byte)((ulong)uVar13 >> 0x10);
      bStack_17ec = (byte)((ulong)uVar13 >> 0x20);
      bStack_17eb = (byte)((ulong)uVar13 >> 0x28);
      bStack_17ea = (byte)((ulong)uVar13 >> 0x30);
      local_1e08 = (byte)uVar6;
      bStack_1e07 = (byte)((ulong)uVar6 >> 8);
      bStack_1e06 = (byte)((ulong)uVar6 >> 0x10);
      bStack_1e04 = (byte)((ulong)uVar6 >> 0x20);
      bStack_1e03 = (byte)((ulong)uVar6 >> 0x28);
      bStack_1e02 = (byte)((ulong)uVar6 >> 0x30);
      local_1e18 = (byte)uVar14;
      bStack_1e17 = (byte)((ulong)uVar14 >> 8);
      bStack_1e16 = (byte)((ulong)uVar14 >> 0x10);
      bStack_1e14 = (byte)((ulong)uVar14 >> 0x20);
      bStack_1e13 = (byte)((ulong)uVar14 >> 0x28);
      bStack_1e12 = (byte)((ulong)uVar14 >> 0x30);
      bStack_1800 = (byte)uVar7;
      bStack_17ff = (byte)((ulong)uVar7 >> 8);
      bStack_17fe = (byte)((ulong)uVar7 >> 0x10);
      bStack_17fc = (byte)((ulong)uVar7 >> 0x20);
      bStack_17fb = (byte)((ulong)uVar7 >> 0x28);
      bStack_17fa = (byte)((ulong)uVar7 >> 0x30);
      bStack_1810 = (byte)uVar15;
      bStack_180f = (byte)((ulong)uVar15 >> 8);
      bStack_180e = (byte)((ulong)uVar15 >> 0x10);
      bStack_180c = (byte)((ulong)uVar15 >> 0x20);
      bStack_180b = (byte)((ulong)uVar15 >> 0x28);
      bStack_180a = (byte)((ulong)uVar15 >> 0x30);
      local_1e28 = (byte)uVar8;
      bStack_1e27 = (byte)((ulong)uVar8 >> 8);
      bStack_1e26 = (byte)((ulong)uVar8 >> 0x10);
      bStack_1e24 = (byte)((ulong)uVar8 >> 0x20);
      bStack_1e23 = (byte)((ulong)uVar8 >> 0x28);
      bStack_1e22 = (byte)((ulong)uVar8 >> 0x30);
      local_1e38 = (byte)uVar16;
      bStack_1e37 = (byte)((ulong)uVar16 >> 8);
      bStack_1e36 = (byte)((ulong)uVar16 >> 0x10);
      bStack_1e34 = (byte)((ulong)uVar16 >> 0x20);
      bStack_1e33 = (byte)((ulong)uVar16 >> 0x28);
      bStack_1e32 = (byte)((ulong)uVar16 >> 0x30);
      bStack_1820 = (byte)uVar9;
      bStack_181f = (byte)((ulong)uVar9 >> 8);
      bStack_181e = (byte)((ulong)uVar9 >> 0x10);
      bStack_181c = (byte)((ulong)uVar9 >> 0x20);
      bStack_181b = (byte)((ulong)uVar9 >> 0x28);
      bStack_181a = (byte)((ulong)uVar9 >> 0x30);
      bStack_1830 = (byte)uVar17;
      bStack_182f = (byte)((ulong)uVar17 >> 8);
      bStack_182e = (byte)((ulong)uVar17 >> 0x10);
      bStack_182c = (byte)((ulong)uVar17 >> 0x20);
      bStack_182b = (byte)((ulong)uVar17 >> 0x28);
      bStack_182a = (byte)((ulong)uVar17 >> 0x30);
      local_1e48 = (byte)uVar10;
      bStack_1e47 = (byte)((ulong)uVar10 >> 8);
      bStack_1e46 = (byte)((ulong)uVar10 >> 0x10);
      bStack_1e44 = (byte)((ulong)uVar10 >> 0x20);
      bStack_1e43 = (byte)((ulong)uVar10 >> 0x28);
      bStack_1e42 = (byte)((ulong)uVar10 >> 0x30);
      local_1e58 = (byte)uVar18;
      bStack_1e57 = (byte)((ulong)uVar18 >> 8);
      bStack_1e56 = (byte)((ulong)uVar18 >> 0x10);
      bStack_1e54 = (byte)((ulong)uVar18 >> 0x20);
      bStack_1e53 = (byte)((ulong)uVar18 >> 0x28);
      bStack_1e52 = (byte)((ulong)uVar18 >> 0x30);
      bStack_1840 = (byte)uVar11;
      bStack_183f = (byte)((ulong)uVar11 >> 8);
      bStack_183e = (byte)((ulong)uVar11 >> 0x10);
      bStack_183c = (byte)((ulong)uVar11 >> 0x20);
      bStack_183b = (byte)((ulong)uVar11 >> 0x28);
      bStack_183a = (byte)((ulong)uVar11 >> 0x30);
      bStack_1850 = (byte)uVar19;
      bStack_184f = (byte)((ulong)uVar19 >> 8);
      bStack_184e = (byte)((ulong)uVar19 >> 0x10);
      bStack_184c = (byte)((ulong)uVar19 >> 0x20);
      bStack_184b = (byte)((ulong)uVar19 >> 0x28);
      bStack_184a = (byte)((ulong)uVar19 >> 0x30);
      bVar1 = pRVar27->r_factor;
      uStack_ce6 = (ushort)bStack_17e0;
      uStack_ce4 = (ushort)local_1e08;
      uStack_ce2 = (ushort)bStack_1800;
      uStack_cde = (ushort)bStack_1820;
      uStack_cdc = (ushort)local_1e48;
      uStack_cda = (ushort)bStack_1840;
      uStack_cf6 = (ushort)bVar1;
      uStack_cf4 = (ushort)bVar1;
      uStack_cf2 = (ushort)bVar1;
      uStack_cee = (ushort)bVar1;
      uStack_cec = (ushort)bVar1;
      uStack_cea = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].g_factor;
      uStack_d06 = (ushort)bStack_17df;
      uStack_d04 = (ushort)bStack_1e07;
      uStack_d02 = (ushort)bStack_17ff;
      uStack_cfe = (ushort)bStack_181f;
      uStack_cfc = (ushort)bStack_1e47;
      uStack_cfa = (ushort)bStack_183f;
      uStack_d16 = (ushort)bVar2;
      uStack_d14 = (ushort)bVar2;
      uStack_d12 = (ushort)bVar2;
      uStack_d0e = (ushort)bVar2;
      uStack_d0c = (ushort)bVar2;
      uStack_d0a = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar28].b_factor;
      uStack_d26 = (ushort)bStack_17de;
      uStack_d24 = (ushort)bStack_1e06;
      uStack_d22 = (ushort)bStack_17fe;
      uStack_d1e = (ushort)bStack_181e;
      uStack_d1c = (ushort)bStack_1e46;
      uStack_d1a = (ushort)bStack_183e;
      uStack_d36 = (ushort)bVar3;
      uStack_d34 = (ushort)bVar3;
      uStack_d32 = (ushort)bVar3;
      uStack_d2e = (ushort)bVar3;
      uStack_d2c = (ushort)bVar3;
      uStack_d2a = (ushort)bVar3;
      uVar29 = (ushort)((ushort)local_1de8 * (ushort)bVar1 + (ushort)bStack_1de7 * (ushort)bVar2 +
                       (ushort)bStack_1de6 * (ushort)bVar3) >> 8;
      uVar33 = (ushort)(uStack_ce6 * uStack_cf6 + uStack_d06 * uStack_d16 + uStack_d26 * uStack_d36)
               >> 8;
      uVar37 = (ushort)(uStack_ce4 * uStack_cf4 + uStack_d04 * uStack_d14 + uStack_d24 * uStack_d34)
               >> 8;
      uVar41 = (ushort)(uStack_ce2 * uStack_cf2 + uStack_d02 * uStack_d12 + uStack_d22 * uStack_d32)
               >> 8;
      uVar45 = (ushort)((ushort)local_1e28 * (ushort)bVar1 + (ushort)bStack_1e27 * (ushort)bVar2 +
                       (ushort)bStack_1e26 * (ushort)bVar3) >> 8;
      uVar53 = (ushort)(uStack_cde * uStack_cee + uStack_cfe * uStack_d0e + uStack_d1e * uStack_d2e)
               >> 8;
      uVar57 = (ushort)(uStack_cdc * uStack_cec + uStack_cfc * uStack_d0c + uStack_d1c * uStack_d2c)
               >> 8;
      uVar61 = (ushort)(uStack_cda * uStack_cea + uStack_cfa * uStack_d0a + uStack_d1a * uStack_d2a)
               >> 8;
      uStack_886 = (ushort)bStack_17de;
      uStack_884 = (ushort)bStack_1e06;
      uStack_882 = (ushort)bStack_17fe;
      uStack_87e = (ushort)bStack_181e;
      uStack_87c = (ushort)bStack_1e46;
      uStack_87a = (ushort)bStack_183e;
      uStack_8a6 = (ushort)bStack_17e0;
      uStack_8a4 = (ushort)local_1e08;
      uStack_8a2 = (ushort)bStack_1800;
      uStack_89e = (ushort)bStack_1820;
      uStack_89c = (ushort)local_1e48;
      uStack_89a = (ushort)bStack_1840;
      bVar1 = pRVar27->r_factor;
      uStack_d46 = (ushort)bStack_17dc;
      uStack_d44 = (ushort)bStack_1e04;
      uStack_d42 = (ushort)bStack_17fc;
      uStack_d3e = (ushort)bStack_181c;
      uStack_d3c = (ushort)bStack_1e44;
      uStack_d3a = (ushort)bStack_183c;
      uStack_d56 = (ushort)bVar1;
      uStack_d54 = (ushort)bVar1;
      uStack_d52 = (ushort)bVar1;
      uStack_d4e = (ushort)bVar1;
      uStack_d4c = (ushort)bVar1;
      uStack_d4a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].g_factor;
      uStack_d66 = (ushort)bStack_17db;
      uStack_d64 = (ushort)bStack_1e03;
      uStack_d62 = (ushort)bStack_17fb;
      uStack_d5e = (ushort)bStack_181b;
      uStack_d5c = (ushort)bStack_1e43;
      uStack_d5a = (ushort)bStack_183b;
      uStack_d76 = (ushort)bVar2;
      uStack_d74 = (ushort)bVar2;
      uStack_d72 = (ushort)bVar2;
      uStack_d6e = (ushort)bVar2;
      uStack_d6c = (ushort)bVar2;
      uStack_d6a = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar28].b_factor;
      uStack_d86 = (ushort)bStack_17da;
      uStack_d84 = (ushort)bStack_1e02;
      uStack_d82 = (ushort)bStack_17fa;
      uStack_d7e = (ushort)bStack_181a;
      uStack_d7c = (ushort)bStack_1e42;
      uStack_d7a = (ushort)bStack_183a;
      uStack_d96 = (ushort)bVar3;
      uStack_d94 = (ushort)bVar3;
      uStack_d92 = (ushort)bVar3;
      uStack_d8e = (ushort)bVar3;
      uStack_d8c = (ushort)bVar3;
      uStack_d8a = (ushort)bVar3;
      uVar30 = (ushort)((ushort)bStack_1de4 * (ushort)bVar1 + (ushort)bStack_1de3 * (ushort)bVar2 +
                       (ushort)bStack_1de2 * (ushort)bVar3) >> 8;
      uVar34 = (ushort)(uStack_d46 * uStack_d56 + uStack_d66 * uStack_d76 + uStack_d86 * uStack_d96)
               >> 8;
      uVar38 = (ushort)(uStack_d44 * uStack_d54 + uStack_d64 * uStack_d74 + uStack_d84 * uStack_d94)
               >> 8;
      uVar42 = (ushort)(uStack_d42 * uStack_d52 + uStack_d62 * uStack_d72 + uStack_d82 * uStack_d92)
               >> 8;
      uVar46 = (ushort)((ushort)bStack_1e24 * (ushort)bVar1 + (ushort)bStack_1e23 * (ushort)bVar2 +
                       (ushort)bStack_1e22 * (ushort)bVar3) >> 8;
      uVar54 = (ushort)(uStack_d3e * uStack_d4e + uStack_d5e * uStack_d6e + uStack_d7e * uStack_d8e)
               >> 8;
      uVar58 = (ushort)(uStack_d3c * uStack_d4c + uStack_d5c * uStack_d6c + uStack_d7c * uStack_d8c)
               >> 8;
      uVar62 = (ushort)(uStack_d3a * uStack_d4a + uStack_d5a * uStack_d6a + uStack_d7a * uStack_d8a)
               >> 8;
      uStack_8c6 = (ushort)bStack_17da;
      uStack_8c4 = (ushort)bStack_1e02;
      uStack_8c2 = (ushort)bStack_17fa;
      uStack_8be = (ushort)bStack_181a;
      uStack_8bc = (ushort)bStack_1e42;
      uStack_8ba = (ushort)bStack_183a;
      uStack_8e6 = (ushort)bStack_17dc;
      uStack_8e4 = (ushort)bStack_1e04;
      uStack_8e2 = (ushort)bStack_17fc;
      uStack_8de = (ushort)bStack_181c;
      uStack_8dc = (ushort)bStack_1e44;
      uStack_8da = (ushort)bStack_183c;
      bVar1 = RGB2YUV[uVar28].y_factor;
      uStack_db6 = (ushort)bVar1;
      uStack_db4 = (ushort)bVar1;
      uStack_db2 = (ushort)bVar1;
      uStack_dae = (ushort)bVar1;
      uStack_dac = (ushort)bVar1;
      uStack_daa = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].y_offset;
      uStack_1236 = (ushort)bVar2;
      uStack_1234 = (ushort)bVar2;
      uStack_1232 = (ushort)bVar2;
      uStack_122e = (ushort)bVar2;
      uStack_122c = (ushort)bVar2;
      uStack_122a = (ushort)bVar2;
      uVar31 = ((ushort)(uVar29 * bVar1) >> 7) + (ushort)bVar2;
      uStack_1236 = ((ushort)(uVar33 * uStack_db6) >> 7) + uStack_1236;
      uStack_1234 = ((ushort)(uVar37 * uStack_db4) >> 7) + uStack_1234;
      uStack_1232 = ((ushort)(uVar41 * uStack_db2) >> 7) + uStack_1232;
      uVar47 = ((ushort)(uVar45 * bVar1) >> 7) + (ushort)bVar2;
      uStack_122e = ((ushort)(uVar53 * uStack_dae) >> 7) + uStack_122e;
      uStack_122c = ((ushort)(uVar57 * uStack_dac) >> 7) + uStack_122c;
      uStack_122a = ((ushort)(uVar61 * uStack_daa) >> 7) + uStack_122a;
      bVar1 = RGB2YUV[uVar28].y_factor;
      uStack_dd6 = (ushort)bVar1;
      uStack_dd4 = (ushort)bVar1;
      uStack_dd2 = (ushort)bVar1;
      uStack_dce = (ushort)bVar1;
      uStack_dcc = (ushort)bVar1;
      uStack_dca = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].y_offset;
      uStack_1256 = (ushort)bVar2;
      uStack_1254 = (ushort)bVar2;
      uStack_1252 = (ushort)bVar2;
      uStack_124e = (ushort)bVar2;
      uStack_124c = (ushort)bVar2;
      uStack_124a = (ushort)bVar2;
      uVar32 = ((ushort)(uVar30 * bVar1) >> 7) + (ushort)bVar2;
      uStack_1256 = ((ushort)(uVar34 * uStack_dd6) >> 7) + uStack_1256;
      uStack_1254 = ((ushort)(uVar38 * uStack_dd4) >> 7) + uStack_1254;
      uStack_1252 = ((ushort)(uVar42 * uStack_dd2) >> 7) + uStack_1252;
      uVar48 = ((ushort)(uVar46 * bVar1) >> 7) + (ushort)bVar2;
      uStack_124e = ((ushort)(uVar54 * uStack_dce) >> 7) + uStack_124e;
      uStack_124c = ((ushort)(uVar58 * uStack_dcc) >> 7) + uStack_124c;
      uStack_124a = ((ushort)(uVar62 * uStack_dca) >> 7) + uStack_124a;
      *(ulong *)y_ptr2 =
           CONCAT17((uStack_1252 != 0) * (uStack_1252 < 0x100) * (char)uStack_1252 -
                    (0xff < uStack_1252),
                    CONCAT16((uStack_1232 != 0) * (uStack_1232 < 0x100) * (char)uStack_1232 -
                             (0xff < uStack_1232),
                             CONCAT15((uStack_1254 != 0) * (uStack_1254 < 0x100) * (char)uStack_1254
                                      - (0xff < uStack_1254),
                                      CONCAT14((uStack_1234 != 0) * (uStack_1234 < 0x100) *
                                               (char)uStack_1234 - (0xff < uStack_1234),
                                               CONCAT13((uStack_1256 != 0) * (uStack_1256 < 0x100) *
                                                        (char)uStack_1256 - (0xff < uStack_1256),
                                                        CONCAT12((uStack_1236 != 0) *
                                                                 (uStack_1236 < 0x100) *
                                                                 (char)uStack_1236 -
                                                                 (0xff < uStack_1236),
                                                                 CONCAT11((uVar32 != 0) *
                                                                          (uVar32 < 0x100) *
                                                                          (char)uVar32 -
                                                                          (0xff < uVar32),
                                                                          (uVar31 != 0) *
                                                                          (uVar31 < 0x100) *
                                                                          (char)uVar31 -
                                                                          (0xff < uVar31))))))));
      *(ulong *)(y_ptr2 + 8) =
           CONCAT17((uStack_124a != 0) * (uStack_124a < 0x100) * (char)uStack_124a -
                    (0xff < uStack_124a),
                    CONCAT16((uStack_122a != 0) * (uStack_122a < 0x100) * (char)uStack_122a -
                             (0xff < uStack_122a),
                             CONCAT15((uStack_124c != 0) * (uStack_124c < 0x100) * (char)uStack_124c
                                      - (0xff < uStack_124c),
                                      CONCAT14((uStack_122c != 0) * (uStack_122c < 0x100) *
                                               (char)uStack_122c - (0xff < uStack_122c),
                                               CONCAT13((uStack_124e != 0) * (uStack_124e < 0x100) *
                                                        (char)uStack_124e - (0xff < uStack_124e),
                                                        CONCAT12((uStack_122e != 0) *
                                                                 (uStack_122e < 0x100) *
                                                                 (char)uStack_122e -
                                                                 (0xff < uStack_122e),
                                                                 CONCAT11((uVar48 != 0) *
                                                                          (uVar48 < 0x100) *
                                                                          (char)uVar48 -
                                                                          (0xff < uVar48),
                                                                          (uVar47 != 0) *
                                                                          (uVar47 < 0x100) *
                                                                          (char)uVar47 -
                                                                          (0xff < uVar47))))))));
      bVar1 = pRVar27->r_factor;
      uStack_de6 = (ushort)bStack_17f0;
      uStack_de4 = (ushort)local_1e18;
      uStack_de2 = (ushort)bStack_1810;
      uStack_dde = (ushort)bStack_1830;
      uStack_ddc = (ushort)local_1e58;
      uStack_dda = (ushort)bStack_1850;
      uStack_df6 = (ushort)bVar1;
      uStack_df4 = (ushort)bVar1;
      uStack_df2 = (ushort)bVar1;
      uStack_dee = (ushort)bVar1;
      uStack_dec = (ushort)bVar1;
      uStack_dea = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].g_factor;
      uStack_e06 = (ushort)bStack_17ef;
      uStack_e04 = (ushort)bStack_1e17;
      uStack_e02 = (ushort)bStack_180f;
      uStack_dfe = (ushort)bStack_182f;
      uStack_dfc = (ushort)bStack_1e57;
      uStack_dfa = (ushort)bStack_184f;
      uStack_e16 = (ushort)bVar2;
      uStack_e14 = (ushort)bVar2;
      uStack_e12 = (ushort)bVar2;
      uStack_e0e = (ushort)bVar2;
      uStack_e0c = (ushort)bVar2;
      uStack_e0a = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar28].b_factor;
      uStack_e26 = (ushort)bStack_17ee;
      uStack_e24 = (ushort)bStack_1e16;
      uStack_e22 = (ushort)bStack_180e;
      uStack_e1e = (ushort)bStack_182e;
      uStack_e1c = (ushort)bStack_1e56;
      uStack_e1a = (ushort)bStack_184e;
      uStack_e36 = (ushort)bVar3;
      uStack_e34 = (ushort)bVar3;
      uStack_e32 = (ushort)bVar3;
      uStack_e2e = (ushort)bVar3;
      uStack_e2c = (ushort)bVar3;
      uStack_e2a = (ushort)bVar3;
      uVar31 = (ushort)((ushort)local_1df8 * (ushort)bVar1 + (ushort)bStack_1df7 * (ushort)bVar2 +
                       (ushort)bStack_1df6 * (ushort)bVar3) >> 8;
      uVar35 = (ushort)(uStack_de6 * uStack_df6 + uStack_e06 * uStack_e16 + uStack_e26 * uStack_e36)
               >> 8;
      uVar39 = (ushort)(uStack_de4 * uStack_df4 + uStack_e04 * uStack_e14 + uStack_e24 * uStack_e34)
               >> 8;
      uVar43 = (ushort)(uStack_de2 * uStack_df2 + uStack_e02 * uStack_e12 + uStack_e22 * uStack_e32)
               >> 8;
      uVar49 = (ushort)((ushort)local_1e38 * (ushort)bVar1 + (ushort)bStack_1e37 * (ushort)bVar2 +
                       (ushort)bStack_1e36 * (ushort)bVar3) >> 8;
      uVar55 = (ushort)(uStack_dde * uStack_dee + uStack_dfe * uStack_e0e + uStack_e1e * uStack_e2e)
               >> 8;
      uVar59 = (ushort)(uStack_ddc * uStack_dec + uStack_dfc * uStack_e0c + uStack_e1c * uStack_e2c)
               >> 8;
      uVar63 = (ushort)(uStack_dda * uStack_dea + uStack_dfa * uStack_e0a + uStack_e1a * uStack_e2a)
               >> 8;
      uStack_906 = (ushort)bStack_17ee;
      uStack_904 = (ushort)bStack_1e16;
      uStack_902 = (ushort)bStack_180e;
      uStack_8fe = (ushort)bStack_182e;
      uStack_8fc = (ushort)bStack_1e56;
      uStack_8fa = (ushort)bStack_184e;
      uStack_926 = (ushort)bStack_17f0;
      uStack_924 = (ushort)local_1e18;
      uStack_922 = (ushort)bStack_1810;
      uStack_91e = (ushort)bStack_1830;
      uStack_91c = (ushort)local_1e58;
      uStack_91a = (ushort)bStack_1850;
      bVar1 = pRVar27->r_factor;
      uStack_e46 = (ushort)bStack_17ec;
      uStack_e44 = (ushort)bStack_1e14;
      uStack_e42 = (ushort)bStack_180c;
      uStack_e3e = (ushort)bStack_182c;
      uStack_e3c = (ushort)bStack_1e54;
      uStack_e3a = (ushort)bStack_184c;
      uStack_e56 = (ushort)bVar1;
      uStack_e54 = (ushort)bVar1;
      uStack_e52 = (ushort)bVar1;
      uStack_e4e = (ushort)bVar1;
      uStack_e4c = (ushort)bVar1;
      uStack_e4a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].g_factor;
      uStack_e66 = (ushort)bStack_17eb;
      uStack_e64 = (ushort)bStack_1e13;
      uStack_e62 = (ushort)bStack_180b;
      uStack_e5e = (ushort)bStack_182b;
      uStack_e5c = (ushort)bStack_1e53;
      uStack_e5a = (ushort)bStack_184b;
      uStack_e76 = (ushort)bVar2;
      uStack_e74 = (ushort)bVar2;
      uStack_e72 = (ushort)bVar2;
      uStack_e6e = (ushort)bVar2;
      uStack_e6c = (ushort)bVar2;
      uStack_e6a = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar28].b_factor;
      uStack_e86 = (ushort)bStack_17ea;
      uStack_e84 = (ushort)bStack_1e12;
      uStack_e82 = (ushort)bStack_180a;
      uStack_e7e = (ushort)bStack_182a;
      uStack_e7c = (ushort)bStack_1e52;
      uStack_e7a = (ushort)bStack_184a;
      uStack_e96 = (ushort)bVar3;
      uStack_e94 = (ushort)bVar3;
      uStack_e92 = (ushort)bVar3;
      uStack_e8e = (ushort)bVar3;
      uStack_e8c = (ushort)bVar3;
      uStack_e8a = (ushort)bVar3;
      uVar32 = (ushort)((ushort)bStack_1df4 * (ushort)bVar1 + (ushort)bStack_1df3 * (ushort)bVar2 +
                       (ushort)bStack_1df2 * (ushort)bVar3) >> 8;
      uVar36 = (ushort)(uStack_e46 * uStack_e56 + uStack_e66 * uStack_e76 + uStack_e86 * uStack_e96)
               >> 8;
      uVar40 = (ushort)(uStack_e44 * uStack_e54 + uStack_e64 * uStack_e74 + uStack_e84 * uStack_e94)
               >> 8;
      uVar44 = (ushort)(uStack_e42 * uStack_e52 + uStack_e62 * uStack_e72 + uStack_e82 * uStack_e92)
               >> 8;
      uVar50 = (ushort)((ushort)bStack_1e34 * (ushort)bVar1 + (ushort)bStack_1e33 * (ushort)bVar2 +
                       (ushort)bStack_1e32 * (ushort)bVar3) >> 8;
      uVar56 = (ushort)(uStack_e3e * uStack_e4e + uStack_e5e * uStack_e6e + uStack_e7e * uStack_e8e)
               >> 8;
      uVar60 = (ushort)(uStack_e3c * uStack_e4c + uStack_e5c * uStack_e6c + uStack_e7c * uStack_e8c)
               >> 8;
      uVar64 = (ushort)(uStack_e3a * uStack_e4a + uStack_e5a * uStack_e6a + uStack_e7a * uStack_e8a)
               >> 8;
      uStack_946 = (ushort)bStack_17ea;
      uStack_944 = (ushort)bStack_1e12;
      uStack_942 = (ushort)bStack_180a;
      uStack_93e = (ushort)bStack_182a;
      uStack_93c = (ushort)bStack_1e52;
      uStack_93a = (ushort)bStack_184a;
      uStack_966 = (ushort)bStack_17ec;
      uStack_964 = (ushort)bStack_1e14;
      uStack_962 = (ushort)bStack_180c;
      uStack_95e = (ushort)bStack_182c;
      uStack_95c = (ushort)bStack_1e54;
      uStack_95a = (ushort)bStack_184c;
      bVar1 = RGB2YUV[uVar28].y_factor;
      uStack_eb6 = (ushort)bVar1;
      uStack_eb4 = (ushort)bVar1;
      uStack_eb2 = (ushort)bVar1;
      uStack_eae = (ushort)bVar1;
      uStack_eac = (ushort)bVar1;
      uStack_eaa = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].y_offset;
      uStack_1376 = (ushort)bVar2;
      uStack_1374 = (ushort)bVar2;
      uStack_1372 = (ushort)bVar2;
      uStack_136e = (ushort)bVar2;
      uStack_136c = (ushort)bVar2;
      uStack_136a = (ushort)bVar2;
      uVar47 = ((ushort)(uVar31 * bVar1) >> 7) + (ushort)bVar2;
      uStack_1376 = ((ushort)(uVar35 * uStack_eb6) >> 7) + uStack_1376;
      uStack_1374 = ((ushort)(uVar39 * uStack_eb4) >> 7) + uStack_1374;
      uStack_1372 = ((ushort)(uVar43 * uStack_eb2) >> 7) + uStack_1372;
      uVar51 = ((ushort)(uVar49 * bVar1) >> 7) + (ushort)bVar2;
      uStack_136e = ((ushort)(uVar55 * uStack_eae) >> 7) + uStack_136e;
      uStack_136c = ((ushort)(uVar59 * uStack_eac) >> 7) + uStack_136c;
      uStack_136a = ((ushort)(uVar63 * uStack_eaa) >> 7) + uStack_136a;
      bVar1 = RGB2YUV[uVar28].y_factor;
      uStack_ed6 = (ushort)bVar1;
      uStack_ed4 = (ushort)bVar1;
      uStack_ed2 = (ushort)bVar1;
      uStack_ece = (ushort)bVar1;
      uStack_ecc = (ushort)bVar1;
      uStack_eca = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].y_offset;
      uStack_1396 = (ushort)bVar2;
      uStack_1394 = (ushort)bVar2;
      uStack_1392 = (ushort)bVar2;
      uStack_138e = (ushort)bVar2;
      uStack_138c = (ushort)bVar2;
      uStack_138a = (ushort)bVar2;
      uVar48 = ((ushort)(uVar32 * bVar1) >> 7) + (ushort)bVar2;
      uStack_1396 = ((ushort)(uVar36 * uStack_ed6) >> 7) + uStack_1396;
      uStack_1394 = ((ushort)(uVar40 * uStack_ed4) >> 7) + uStack_1394;
      uStack_1392 = ((ushort)(uVar44 * uStack_ed2) >> 7) + uStack_1392;
      uVar52 = ((ushort)(uVar50 * bVar1) >> 7) + (ushort)bVar2;
      uStack_138e = ((ushort)(uVar56 * uStack_ece) >> 7) + uStack_138e;
      uStack_138c = ((ushort)(uVar60 * uStack_ecc) >> 7) + uStack_138c;
      uStack_138a = ((ushort)(uVar64 * uStack_eca) >> 7) + uStack_138a;
      *(ulong *)u_ptr =
           CONCAT17((uStack_1392 != 0) * (uStack_1392 < 0x100) * (char)uStack_1392 -
                    (0xff < uStack_1392),
                    CONCAT16((uStack_1372 != 0) * (uStack_1372 < 0x100) * (char)uStack_1372 -
                             (0xff < uStack_1372),
                             CONCAT15((uStack_1394 != 0) * (uStack_1394 < 0x100) * (char)uStack_1394
                                      - (0xff < uStack_1394),
                                      CONCAT14((uStack_1374 != 0) * (uStack_1374 < 0x100) *
                                               (char)uStack_1374 - (0xff < uStack_1374),
                                               CONCAT13((uStack_1396 != 0) * (uStack_1396 < 0x100) *
                                                        (char)uStack_1396 - (0xff < uStack_1396),
                                                        CONCAT12((uStack_1376 != 0) *
                                                                 (uStack_1376 < 0x100) *
                                                                 (char)uStack_1376 -
                                                                 (0xff < uStack_1376),
                                                                 CONCAT11((uVar48 != 0) *
                                                                          (uVar48 < 0x100) *
                                                                          (char)uVar48 -
                                                                          (0xff < uVar48),
                                                                          (uVar47 != 0) *
                                                                          (uVar47 < 0x100) *
                                                                          (char)uVar47 -
                                                                          (0xff < uVar47))))))));
      *(ulong *)(u_ptr + 8) =
           CONCAT17((uStack_138a != 0) * (uStack_138a < 0x100) * (char)uStack_138a -
                    (0xff < uStack_138a),
                    CONCAT16((uStack_136a != 0) * (uStack_136a < 0x100) * (char)uStack_136a -
                             (0xff < uStack_136a),
                             CONCAT15((uStack_138c != 0) * (uStack_138c < 0x100) * (char)uStack_138c
                                      - (0xff < uStack_138c),
                                      CONCAT14((uStack_136c != 0) * (uStack_136c < 0x100) *
                                               (char)uStack_136c - (0xff < uStack_136c),
                                               CONCAT13((uStack_138e != 0) * (uStack_138e < 0x100) *
                                                        (char)uStack_138e - (0xff < uStack_138e),
                                                        CONCAT12((uStack_136e != 0) *
                                                                 (uStack_136e < 0x100) *
                                                                 (char)uStack_136e -
                                                                 (0xff < uStack_136e),
                                                                 CONCAT11((uVar52 != 0) *
                                                                          (uVar52 < 0x100) *
                                                                          (char)uVar52 -
                                                                          (0xff < uVar52),
                                                                          (uVar51 != 0) *
                                                                          (uVar51 < 0x100) *
                                                                          (char)uVar51 -
                                                                          (0xff < uVar51))))))));
      auVar26._2_2_ =
           (uStack_886 - uVar33) + (uStack_8c6 - uVar34) + (uStack_906 - uVar35) +
           (uStack_946 - uVar36);
      auVar26._0_2_ =
           (bStack_1de6 - uVar29) + (bStack_1de2 - uVar30) + (bStack_1df6 - uVar31) +
           (bStack_1df2 - uVar32);
      auVar26._4_2_ =
           (uStack_884 - uVar37) + (uStack_8c4 - uVar38) + (uStack_904 - uVar39) +
           (uStack_944 - uVar40);
      auVar26._6_2_ =
           (uStack_882 - uVar41) + (uStack_8c2 - uVar42) + (uStack_902 - uVar43) +
           (uStack_942 - uVar44);
      auVar26._10_2_ =
           (uStack_87e - uVar53) + (uStack_8be - uVar54) + (uStack_8fe - uVar55) +
           (uStack_93e - uVar56);
      auVar26._8_2_ =
           (bStack_1e26 - uVar45) + (bStack_1e22 - uVar46) + (bStack_1e36 - uVar49) +
           (bStack_1e32 - uVar50);
      auVar26._12_2_ =
           (uStack_87c - uVar57) + (uStack_8bc - uVar58) + (uStack_8fc - uVar59) +
           (uStack_93c - uVar60);
      auVar26._14_2_ =
           (uStack_87a - uVar61) + (uStack_8ba - uVar62) + (uStack_8fa - uVar63) +
           (uStack_93a - uVar64);
      auVar65 = psraw(auVar26,ZEXT416(2));
      bVar1 = RGB2YUV[uVar28].cb_factor;
      local_ee8 = auVar65._0_2_;
      sStack_ee6 = auVar65._2_2_;
      sStack_ee4 = auVar65._4_2_;
      sStack_ee2 = auVar65._6_2_;
      sStack_ee0 = auVar65._8_2_;
      sStack_ede = auVar65._10_2_;
      sStack_edc = auVar65._12_2_;
      sStack_eda = auVar65._14_2_;
      uStack_ef6 = (ushort)bVar1;
      uStack_ef4 = (ushort)bVar1;
      uStack_ef2 = (ushort)bVar1;
      uStack_eee = (ushort)bVar1;
      uStack_eec = (ushort)bVar1;
      uStack_eea = (ushort)bVar1;
      auVar25._2_2_ = sStack_ee6 * uStack_ef6;
      auVar25._0_2_ = local_ee8 * (ushort)bVar1;
      auVar25._4_2_ = sStack_ee4 * uStack_ef4;
      auVar25._6_2_ = sStack_ee2 * uStack_ef2;
      auVar25._8_2_ = sStack_ee0 * (ushort)bVar1;
      auVar25._10_2_ = sStack_ede * uStack_eee;
      auVar25._12_2_ = sStack_edc * uStack_eec;
      auVar25._14_2_ = sStack_eda * uStack_eea;
      auVar65 = psraw(auVar25,ZEXT416(8));
      local_13a8 = auVar65._0_2_;
      sStack_13a6 = auVar65._2_2_;
      sStack_13a4 = auVar65._4_2_;
      sStack_13a2 = auVar65._6_2_;
      sStack_13a0 = auVar65._8_2_;
      sStack_139e = auVar65._10_2_;
      sStack_139c = auVar65._12_2_;
      sStack_139a = auVar65._14_2_;
      local_13a8 = local_13a8 + 0x80;
      sStack_13a6 = sStack_13a6 + 0x80;
      sStack_13a4 = sStack_13a4 + 0x80;
      sStack_13a2 = sStack_13a2 + 0x80;
      sStack_13a0 = sStack_13a0 + 0x80;
      sStack_139e = sStack_139e + 0x80;
      sStack_139c = sStack_139c + 0x80;
      sStack_139a = sStack_139a + 0x80;
      auVar24._2_2_ =
           (uStack_8a6 - uVar33) + (uStack_8e6 - uVar34) + (uStack_926 - uVar35) +
           (uStack_966 - uVar36);
      auVar24._0_2_ =
           (local_1de8 - uVar29) + (bStack_1de4 - uVar30) + (local_1df8 - uVar31) +
           (bStack_1df4 - uVar32);
      auVar24._4_2_ =
           (uStack_8a4 - uVar37) + (uStack_8e4 - uVar38) + (uStack_924 - uVar39) +
           (uStack_964 - uVar40);
      auVar24._6_2_ =
           (uStack_8a2 - uVar41) + (uStack_8e2 - uVar42) + (uStack_922 - uVar43) +
           (uStack_962 - uVar44);
      auVar24._10_2_ =
           (uStack_89e - uVar53) + (uStack_8de - uVar54) + (uStack_91e - uVar55) +
           (uStack_95e - uVar56);
      auVar24._8_2_ =
           (local_1e28 - uVar45) + (bStack_1e24 - uVar46) + (local_1e38 - uVar49) +
           (bStack_1e34 - uVar50);
      auVar24._12_2_ =
           (uStack_89c - uVar57) + (uStack_8dc - uVar58) + (uStack_91c - uVar59) +
           (uStack_95c - uVar60);
      auVar24._14_2_ =
           (uStack_89a - uVar61) + (uStack_8da - uVar62) + (uStack_91a - uVar63) +
           (uStack_95a - uVar64);
      auVar65 = psraw(auVar24,ZEXT416(2));
      bVar1 = RGB2YUV[uVar28].cr_factor;
      local_f08 = auVar65._0_2_;
      sStack_f06 = auVar65._2_2_;
      sStack_f04 = auVar65._4_2_;
      sStack_f02 = auVar65._6_2_;
      sStack_f00 = auVar65._8_2_;
      sStack_efe = auVar65._10_2_;
      sStack_efc = auVar65._12_2_;
      sStack_efa = auVar65._14_2_;
      uStack_f16 = (ushort)bVar1;
      uStack_f14 = (ushort)bVar1;
      uStack_f12 = (ushort)bVar1;
      uStack_f0e = (ushort)bVar1;
      uStack_f0c = (ushort)bVar1;
      uStack_f0a = (ushort)bVar1;
      auVar23._2_2_ = sStack_f06 * uStack_f16;
      auVar23._0_2_ = local_f08 * (ushort)bVar1;
      auVar23._4_2_ = sStack_f04 * uStack_f14;
      auVar23._6_2_ = sStack_f02 * uStack_f12;
      auVar23._8_2_ = sStack_f00 * (ushort)bVar1;
      auVar23._10_2_ = sStack_efe * uStack_f0e;
      auVar23._12_2_ = sStack_efc * uStack_f0c;
      auVar23._14_2_ = sStack_efa * uStack_f0a;
      auVar65 = psraw(auVar23,ZEXT416(8));
      local_13c8 = auVar65._0_2_;
      sStack_13c6 = auVar65._2_2_;
      sStack_13c4 = auVar65._4_2_;
      sStack_13c2 = auVar65._6_2_;
      sStack_13c0 = auVar65._8_2_;
      sStack_13be = auVar65._10_2_;
      sStack_13bc = auVar65._12_2_;
      sStack_13ba = auVar65._14_2_;
      local_13c8 = local_13c8 + 0x80;
      sStack_13c6 = sStack_13c6 + 0x80;
      sStack_13c4 = sStack_13c4 + 0x80;
      sStack_13c2 = sStack_13c2 + 0x80;
      sStack_13c0 = sStack_13c0 + 0x80;
      sStack_13be = sStack_13be + 0x80;
      sStack_13bc = sStack_13bc + 0x80;
      sStack_13ba = sStack_13ba + 0x80;
      uVar4 = *(undefined8 *)(rgb_ptr2 + 0x40);
      uVar5 = *(undefined8 *)(rgb_ptr2 + 0x48);
      uVar6 = *(undefined8 *)(rgb_ptr2 + 0x50);
      uVar7 = *(undefined8 *)(rgb_ptr2 + 0x58);
      uVar8 = *(undefined8 *)(rgb_ptr2 + 0x60);
      uVar9 = *(undefined8 *)(rgb_ptr2 + 0x68);
      uVar10 = *(undefined8 *)(rgb_ptr2 + 0x70);
      uVar11 = *(undefined8 *)(rgb_ptr2 + 0x78);
      uVar12 = *(undefined8 *)(y_ptr1 + 0x40);
      uVar13 = *(undefined8 *)(y_ptr1 + 0x48);
      uVar14 = *(undefined8 *)(y_ptr1 + 0x50);
      uVar15 = *(undefined8 *)(y_ptr1 + 0x58);
      uVar16 = *(undefined8 *)(y_ptr1 + 0x60);
      uVar17 = *(undefined8 *)(y_ptr1 + 0x68);
      uVar18 = *(undefined8 *)(y_ptr1 + 0x70);
      uVar19 = *(undefined8 *)(y_ptr1 + 0x78);
      local_20a8 = (byte)uVar4;
      bStack_20a7 = (byte)((ulong)uVar4 >> 8);
      bStack_20a6 = (byte)((ulong)uVar4 >> 0x10);
      bStack_20a4 = (byte)((ulong)uVar4 >> 0x20);
      bStack_20a3 = (byte)((ulong)uVar4 >> 0x28);
      bStack_20a2 = (byte)((ulong)uVar4 >> 0x30);
      local_20b8 = (byte)uVar12;
      bStack_20b7 = (byte)((ulong)uVar12 >> 8);
      bStack_20b6 = (byte)((ulong)uVar12 >> 0x10);
      bStack_20b4 = (byte)((ulong)uVar12 >> 0x20);
      bStack_20b3 = (byte)((ulong)uVar12 >> 0x28);
      bStack_20b2 = (byte)((ulong)uVar12 >> 0x30);
      bStack_1ae0 = (byte)uVar5;
      bStack_1adf = (byte)((ulong)uVar5 >> 8);
      bStack_1ade = (byte)((ulong)uVar5 >> 0x10);
      bStack_1adc = (byte)((ulong)uVar5 >> 0x20);
      bStack_1adb = (byte)((ulong)uVar5 >> 0x28);
      bStack_1ada = (byte)((ulong)uVar5 >> 0x30);
      bStack_1af0 = (byte)uVar13;
      bStack_1aef = (byte)((ulong)uVar13 >> 8);
      bStack_1aee = (byte)((ulong)uVar13 >> 0x10);
      bStack_1aec = (byte)((ulong)uVar13 >> 0x20);
      bStack_1aeb = (byte)((ulong)uVar13 >> 0x28);
      bStack_1aea = (byte)((ulong)uVar13 >> 0x30);
      local_20c8 = (byte)uVar6;
      bStack_20c7 = (byte)((ulong)uVar6 >> 8);
      bStack_20c6 = (byte)((ulong)uVar6 >> 0x10);
      bStack_20c4 = (byte)((ulong)uVar6 >> 0x20);
      bStack_20c3 = (byte)((ulong)uVar6 >> 0x28);
      bStack_20c2 = (byte)((ulong)uVar6 >> 0x30);
      local_20d8 = (byte)uVar14;
      bStack_20d7 = (byte)((ulong)uVar14 >> 8);
      bStack_20d6 = (byte)((ulong)uVar14 >> 0x10);
      bStack_20d4 = (byte)((ulong)uVar14 >> 0x20);
      bStack_20d3 = (byte)((ulong)uVar14 >> 0x28);
      bStack_20d2 = (byte)((ulong)uVar14 >> 0x30);
      bStack_1b00 = (byte)uVar7;
      bStack_1aff = (byte)((ulong)uVar7 >> 8);
      bStack_1afe = (byte)((ulong)uVar7 >> 0x10);
      bStack_1afc = (byte)((ulong)uVar7 >> 0x20);
      bStack_1afb = (byte)((ulong)uVar7 >> 0x28);
      bStack_1afa = (byte)((ulong)uVar7 >> 0x30);
      bStack_1b10 = (byte)uVar15;
      bStack_1b0f = (byte)((ulong)uVar15 >> 8);
      bStack_1b0e = (byte)((ulong)uVar15 >> 0x10);
      bStack_1b0c = (byte)((ulong)uVar15 >> 0x20);
      bStack_1b0b = (byte)((ulong)uVar15 >> 0x28);
      bStack_1b0a = (byte)((ulong)uVar15 >> 0x30);
      local_20e8 = (byte)uVar8;
      bStack_20e7 = (byte)((ulong)uVar8 >> 8);
      bStack_20e6 = (byte)((ulong)uVar8 >> 0x10);
      bStack_20e4 = (byte)((ulong)uVar8 >> 0x20);
      bStack_20e3 = (byte)((ulong)uVar8 >> 0x28);
      bStack_20e2 = (byte)((ulong)uVar8 >> 0x30);
      local_20f8 = (byte)uVar16;
      bStack_20f7 = (byte)((ulong)uVar16 >> 8);
      bStack_20f6 = (byte)((ulong)uVar16 >> 0x10);
      bStack_20f4 = (byte)((ulong)uVar16 >> 0x20);
      bStack_20f3 = (byte)((ulong)uVar16 >> 0x28);
      bStack_20f2 = (byte)((ulong)uVar16 >> 0x30);
      bStack_1b20 = (byte)uVar9;
      bStack_1b1f = (byte)((ulong)uVar9 >> 8);
      bStack_1b1e = (byte)((ulong)uVar9 >> 0x10);
      bStack_1b1c = (byte)((ulong)uVar9 >> 0x20);
      bStack_1b1b = (byte)((ulong)uVar9 >> 0x28);
      bStack_1b1a = (byte)((ulong)uVar9 >> 0x30);
      bStack_1b30 = (byte)uVar17;
      bStack_1b2f = (byte)((ulong)uVar17 >> 8);
      bStack_1b2e = (byte)((ulong)uVar17 >> 0x10);
      bStack_1b2c = (byte)((ulong)uVar17 >> 0x20);
      bStack_1b2b = (byte)((ulong)uVar17 >> 0x28);
      bStack_1b2a = (byte)((ulong)uVar17 >> 0x30);
      local_2108 = (byte)uVar10;
      bStack_2107 = (byte)((ulong)uVar10 >> 8);
      bStack_2106 = (byte)((ulong)uVar10 >> 0x10);
      bStack_2104 = (byte)((ulong)uVar10 >> 0x20);
      bStack_2103 = (byte)((ulong)uVar10 >> 0x28);
      bStack_2102 = (byte)((ulong)uVar10 >> 0x30);
      local_2118 = (byte)uVar18;
      bStack_2117 = (byte)((ulong)uVar18 >> 8);
      bStack_2116 = (byte)((ulong)uVar18 >> 0x10);
      bStack_2114 = (byte)((ulong)uVar18 >> 0x20);
      bStack_2113 = (byte)((ulong)uVar18 >> 0x28);
      bStack_2112 = (byte)((ulong)uVar18 >> 0x30);
      bStack_1b40 = (byte)uVar11;
      bStack_1b3f = (byte)((ulong)uVar11 >> 8);
      bStack_1b3e = (byte)((ulong)uVar11 >> 0x10);
      bStack_1b3c = (byte)((ulong)uVar11 >> 0x20);
      bStack_1b3b = (byte)((ulong)uVar11 >> 0x28);
      bStack_1b3a = (byte)((ulong)uVar11 >> 0x30);
      bStack_1b50 = (byte)uVar19;
      bStack_1b4f = (byte)((ulong)uVar19 >> 8);
      bStack_1b4e = (byte)((ulong)uVar19 >> 0x10);
      bStack_1b4c = (byte)((ulong)uVar19 >> 0x20);
      bStack_1b4b = (byte)((ulong)uVar19 >> 0x28);
      bStack_1b4a = (byte)((ulong)uVar19 >> 0x30);
      bVar1 = pRVar27->r_factor;
      uStack_f26 = (ushort)bStack_1ae0;
      uStack_f24 = (ushort)local_20c8;
      uStack_f22 = (ushort)bStack_1b00;
      uStack_f1e = (ushort)bStack_1b20;
      uStack_f1c = (ushort)local_2108;
      uStack_f1a = (ushort)bStack_1b40;
      uStack_f36 = (ushort)bVar1;
      uStack_f34 = (ushort)bVar1;
      uStack_f32 = (ushort)bVar1;
      uStack_f2e = (ushort)bVar1;
      uStack_f2c = (ushort)bVar1;
      uStack_f2a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].g_factor;
      uStack_f46 = (ushort)bStack_1adf;
      uStack_f44 = (ushort)bStack_20c7;
      uStack_f42 = (ushort)bStack_1aff;
      uStack_f3e = (ushort)bStack_1b1f;
      uStack_f3c = (ushort)bStack_2107;
      uStack_f3a = (ushort)bStack_1b3f;
      uStack_f56 = (ushort)bVar2;
      uStack_f54 = (ushort)bVar2;
      uStack_f52 = (ushort)bVar2;
      uStack_f4e = (ushort)bVar2;
      uStack_f4c = (ushort)bVar2;
      uStack_f4a = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar28].b_factor;
      uStack_f66 = (ushort)bStack_1ade;
      uStack_f64 = (ushort)bStack_20c6;
      uStack_f62 = (ushort)bStack_1afe;
      uStack_f5e = (ushort)bStack_1b1e;
      uStack_f5c = (ushort)bStack_2106;
      uStack_f5a = (ushort)bStack_1b3e;
      uStack_f76 = (ushort)bVar3;
      uStack_f74 = (ushort)bVar3;
      uStack_f72 = (ushort)bVar3;
      uStack_f6e = (ushort)bVar3;
      uStack_f6c = (ushort)bVar3;
      uStack_f6a = (ushort)bVar3;
      uVar39 = (ushort)((ushort)local_20a8 * (ushort)bVar1 + (ushort)bStack_20a7 * (ushort)bVar2 +
                       (ushort)bStack_20a6 * (ushort)bVar3) >> 8;
      uVar42 = (ushort)(uStack_f26 * uStack_f36 + uStack_f46 * uStack_f56 + uStack_f66 * uStack_f76)
               >> 8;
      uVar45 = (ushort)(uStack_f24 * uStack_f34 + uStack_f44 * uStack_f54 + uStack_f64 * uStack_f74)
               >> 8;
      uVar50 = (ushort)(uStack_f22 * uStack_f32 + uStack_f42 * uStack_f52 + uStack_f62 * uStack_f72)
               >> 8;
      uVar53 = (ushort)((ushort)local_20e8 * (ushort)bVar1 + (ushort)bStack_20e7 * (ushort)bVar2 +
                       (ushort)bStack_20e6 * (ushort)bVar3) >> 8;
      uVar56 = (ushort)(uStack_f1e * uStack_f2e + uStack_f3e * uStack_f4e + uStack_f5e * uStack_f6e)
               >> 8;
      uVar59 = (ushort)(uStack_f1c * uStack_f2c + uStack_f3c * uStack_f4c + uStack_f5c * uStack_f6c)
               >> 8;
      uVar62 = (ushort)(uStack_f1a * uStack_f2a + uStack_f3a * uStack_f4a + uStack_f5a * uStack_f6a)
               >> 8;
      uStack_986 = (ushort)bStack_1ade;
      uStack_984 = (ushort)bStack_20c6;
      uStack_982 = (ushort)bStack_1afe;
      uStack_97e = (ushort)bStack_1b1e;
      uStack_97c = (ushort)bStack_2106;
      uStack_97a = (ushort)bStack_1b3e;
      uStack_9a6 = (ushort)bStack_1ae0;
      uStack_9a4 = (ushort)local_20c8;
      uStack_9a2 = (ushort)bStack_1b00;
      uStack_99e = (ushort)bStack_1b20;
      uStack_99c = (ushort)local_2108;
      uStack_99a = (ushort)bStack_1b40;
      bVar1 = pRVar27->r_factor;
      uStack_f86 = (ushort)bStack_1adc;
      uStack_f84 = (ushort)bStack_20c4;
      uStack_f82 = (ushort)bStack_1afc;
      uStack_f7e = (ushort)bStack_1b1c;
      uStack_f7c = (ushort)bStack_2104;
      uStack_f7a = (ushort)bStack_1b3c;
      uStack_f96 = (ushort)bVar1;
      uStack_f94 = (ushort)bVar1;
      uStack_f92 = (ushort)bVar1;
      uStack_f8e = (ushort)bVar1;
      uStack_f8c = (ushort)bVar1;
      uStack_f8a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].g_factor;
      uStack_fa6 = (ushort)bStack_1adb;
      uStack_fa4 = (ushort)bStack_20c3;
      uStack_fa2 = (ushort)bStack_1afb;
      uStack_f9e = (ushort)bStack_1b1b;
      uStack_f9c = (ushort)bStack_2103;
      uStack_f9a = (ushort)bStack_1b3b;
      uStack_fb6 = (ushort)bVar2;
      uStack_fb4 = (ushort)bVar2;
      uStack_fb2 = (ushort)bVar2;
      uStack_fae = (ushort)bVar2;
      uStack_fac = (ushort)bVar2;
      uStack_faa = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar28].b_factor;
      uStack_fc6 = (ushort)bStack_1ada;
      uStack_fc4 = (ushort)bStack_20c2;
      uStack_fc2 = (ushort)bStack_1afa;
      uStack_fbe = (ushort)bStack_1b1a;
      uStack_fbc = (ushort)bStack_2102;
      uStack_fba = (ushort)bStack_1b3a;
      uStack_fd6 = (ushort)bVar3;
      uStack_fd4 = (ushort)bVar3;
      uStack_fd2 = (ushort)bVar3;
      uStack_fce = (ushort)bVar3;
      uStack_fcc = (ushort)bVar3;
      uStack_fca = (ushort)bVar3;
      uVar40 = (ushort)((ushort)bStack_20a4 * (ushort)bVar1 + (ushort)bStack_20a3 * (ushort)bVar2 +
                       (ushort)bStack_20a2 * (ushort)bVar3) >> 8;
      uVar43 = (ushort)(uStack_f86 * uStack_f96 + uStack_fa6 * uStack_fb6 + uStack_fc6 * uStack_fd6)
               >> 8;
      uVar46 = (ushort)(uStack_f84 * uStack_f94 + uStack_fa4 * uStack_fb4 + uStack_fc4 * uStack_fd4)
               >> 8;
      uVar51 = (ushort)(uStack_f82 * uStack_f92 + uStack_fa2 * uStack_fb2 + uStack_fc2 * uStack_fd2)
               >> 8;
      uVar54 = (ushort)((ushort)bStack_20e4 * (ushort)bVar1 + (ushort)bStack_20e3 * (ushort)bVar2 +
                       (ushort)bStack_20e2 * (ushort)bVar3) >> 8;
      uVar57 = (ushort)(uStack_f7e * uStack_f8e + uStack_f9e * uStack_fae + uStack_fbe * uStack_fce)
               >> 8;
      uVar60 = (ushort)(uStack_f7c * uStack_f8c + uStack_f9c * uStack_fac + uStack_fbc * uStack_fcc)
               >> 8;
      uVar63 = (ushort)(uStack_f7a * uStack_f8a + uStack_f9a * uStack_faa + uStack_fba * uStack_fca)
               >> 8;
      uStack_9c6 = (ushort)bStack_1ada;
      uStack_9c4 = (ushort)bStack_20c2;
      uStack_9c2 = (ushort)bStack_1afa;
      uStack_9be = (ushort)bStack_1b1a;
      uStack_9bc = (ushort)bStack_2102;
      uStack_9ba = (ushort)bStack_1b3a;
      uStack_9e6 = (ushort)bStack_1adc;
      uStack_9e4 = (ushort)bStack_20c4;
      uStack_9e2 = (ushort)bStack_1afc;
      uStack_9de = (ushort)bStack_1b1c;
      uStack_9dc = (ushort)bStack_2104;
      uStack_9da = (ushort)bStack_1b3c;
      bVar1 = RGB2YUV[uVar28].y_factor;
      uStack_ff6 = (ushort)bVar1;
      uStack_ff4 = (ushort)bVar1;
      uStack_ff2 = (ushort)bVar1;
      uStack_fee = (ushort)bVar1;
      uStack_fec = (ushort)bVar1;
      uStack_fea = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].y_offset;
      uStack_14b6 = (ushort)bVar2;
      uStack_14b4 = (ushort)bVar2;
      uStack_14b2 = (ushort)bVar2;
      uStack_14ae = (ushort)bVar2;
      uStack_14ac = (ushort)bVar2;
      uStack_14aa = (ushort)bVar2;
      uVar29 = ((ushort)(uVar39 * bVar1) >> 7) + (ushort)bVar2;
      uStack_14b6 = ((ushort)(uVar42 * uStack_ff6) >> 7) + uStack_14b6;
      uStack_14b4 = ((ushort)(uVar45 * uStack_ff4) >> 7) + uStack_14b4;
      uStack_14b2 = ((ushort)(uVar50 * uStack_ff2) >> 7) + uStack_14b2;
      uVar31 = ((ushort)(uVar53 * bVar1) >> 7) + (ushort)bVar2;
      uStack_14ae = ((ushort)(uVar56 * uStack_fee) >> 7) + uStack_14ae;
      uStack_14ac = ((ushort)(uVar59 * uStack_fec) >> 7) + uStack_14ac;
      uStack_14aa = ((ushort)(uVar62 * uStack_fea) >> 7) + uStack_14aa;
      bVar1 = RGB2YUV[uVar28].y_factor;
      uStack_1016 = (ushort)bVar1;
      uStack_1014 = (ushort)bVar1;
      uStack_1012 = (ushort)bVar1;
      uStack_100e = (ushort)bVar1;
      uStack_100c = (ushort)bVar1;
      uStack_100a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].y_offset;
      uStack_14d6 = (ushort)bVar2;
      uStack_14d4 = (ushort)bVar2;
      uStack_14d2 = (ushort)bVar2;
      uStack_14ce = (ushort)bVar2;
      uStack_14cc = (ushort)bVar2;
      uStack_14ca = (ushort)bVar2;
      uVar30 = ((ushort)(uVar40 * bVar1) >> 7) + (ushort)bVar2;
      uStack_14d6 = ((ushort)(uVar43 * uStack_1016) >> 7) + uStack_14d6;
      uStack_14d4 = ((ushort)(uVar46 * uStack_1014) >> 7) + uStack_14d4;
      uStack_14d2 = ((ushort)(uVar51 * uStack_1012) >> 7) + uStack_14d2;
      uVar32 = ((ushort)(uVar54 * bVar1) >> 7) + (ushort)bVar2;
      uStack_14ce = ((ushort)(uVar57 * uStack_100e) >> 7) + uStack_14ce;
      uStack_14cc = ((ushort)(uVar60 * uStack_100c) >> 7) + uStack_14cc;
      uStack_14ca = ((ushort)(uVar63 * uStack_100a) >> 7) + uStack_14ca;
      *(ulong *)(y_ptr2 + 0x10) =
           CONCAT17((uStack_14d2 != 0) * (uStack_14d2 < 0x100) * (char)uStack_14d2 -
                    (0xff < uStack_14d2),
                    CONCAT16((uStack_14b2 != 0) * (uStack_14b2 < 0x100) * (char)uStack_14b2 -
                             (0xff < uStack_14b2),
                             CONCAT15((uStack_14d4 != 0) * (uStack_14d4 < 0x100) * (char)uStack_14d4
                                      - (0xff < uStack_14d4),
                                      CONCAT14((uStack_14b4 != 0) * (uStack_14b4 < 0x100) *
                                               (char)uStack_14b4 - (0xff < uStack_14b4),
                                               CONCAT13((uStack_14d6 != 0) * (uStack_14d6 < 0x100) *
                                                        (char)uStack_14d6 - (0xff < uStack_14d6),
                                                        CONCAT12((uStack_14b6 != 0) *
                                                                 (uStack_14b6 < 0x100) *
                                                                 (char)uStack_14b6 -
                                                                 (0xff < uStack_14b6),
                                                                 CONCAT11((uVar30 != 0) *
                                                                          (uVar30 < 0x100) *
                                                                          (char)uVar30 -
                                                                          (0xff < uVar30),
                                                                          (uVar29 != 0) *
                                                                          (uVar29 < 0x100) *
                                                                          (char)uVar29 -
                                                                          (0xff < uVar29))))))));
      *(ulong *)(y_ptr2 + 0x18) =
           CONCAT17((uStack_14ca != 0) * (uStack_14ca < 0x100) * (char)uStack_14ca -
                    (0xff < uStack_14ca),
                    CONCAT16((uStack_14aa != 0) * (uStack_14aa < 0x100) * (char)uStack_14aa -
                             (0xff < uStack_14aa),
                             CONCAT15((uStack_14cc != 0) * (uStack_14cc < 0x100) * (char)uStack_14cc
                                      - (0xff < uStack_14cc),
                                      CONCAT14((uStack_14ac != 0) * (uStack_14ac < 0x100) *
                                               (char)uStack_14ac - (0xff < uStack_14ac),
                                               CONCAT13((uStack_14ce != 0) * (uStack_14ce < 0x100) *
                                                        (char)uStack_14ce - (0xff < uStack_14ce),
                                                        CONCAT12((uStack_14ae != 0) *
                                                                 (uStack_14ae < 0x100) *
                                                                 (char)uStack_14ae -
                                                                 (0xff < uStack_14ae),
                                                                 CONCAT11((uVar32 != 0) *
                                                                          (uVar32 < 0x100) *
                                                                          (char)uVar32 -
                                                                          (0xff < uVar32),
                                                                          (uVar31 != 0) *
                                                                          (uVar31 < 0x100) *
                                                                          (char)uVar31 -
                                                                          (0xff < uVar31))))))));
      bVar1 = pRVar27->r_factor;
      uStack_1026 = (ushort)bStack_1af0;
      uStack_1024 = (ushort)local_20d8;
      uStack_1022 = (ushort)bStack_1b10;
      uStack_101e = (ushort)bStack_1b30;
      uStack_101c = (ushort)local_2118;
      uStack_101a = (ushort)bStack_1b50;
      uStack_1036 = (ushort)bVar1;
      uStack_1034 = (ushort)bVar1;
      uStack_1032 = (ushort)bVar1;
      uStack_102e = (ushort)bVar1;
      uStack_102c = (ushort)bVar1;
      uStack_102a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].g_factor;
      uStack_1046 = (ushort)bStack_1aef;
      uStack_1044 = (ushort)bStack_20d7;
      uStack_1042 = (ushort)bStack_1b0f;
      uStack_103e = (ushort)bStack_1b2f;
      uStack_103c = (ushort)bStack_2117;
      uStack_103a = (ushort)bStack_1b4f;
      uStack_1056 = (ushort)bVar2;
      uStack_1054 = (ushort)bVar2;
      uStack_1052 = (ushort)bVar2;
      uStack_104e = (ushort)bVar2;
      uStack_104c = (ushort)bVar2;
      uStack_104a = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar28].b_factor;
      uStack_1066 = (ushort)bStack_1aee;
      uStack_1064 = (ushort)bStack_20d6;
      uStack_1062 = (ushort)bStack_1b0e;
      uStack_105e = (ushort)bStack_1b2e;
      uStack_105c = (ushort)bStack_2116;
      uStack_105a = (ushort)bStack_1b4e;
      uStack_1076 = (ushort)bVar3;
      uStack_1074 = (ushort)bVar3;
      uStack_1072 = (ushort)bVar3;
      uStack_106e = (ushort)bVar3;
      uStack_106c = (ushort)bVar3;
      uStack_106a = (ushort)bVar3;
      uVar41 = (ushort)((ushort)local_20b8 * (ushort)bVar1 + (ushort)bStack_20b7 * (ushort)bVar2 +
                       (ushort)bStack_20b6 * (ushort)bVar3) >> 8;
      uVar44 = (ushort)(uStack_1026 * uStack_1036 + uStack_1046 * uStack_1056 +
                       uStack_1066 * uStack_1076) >> 8;
      uVar49 = (ushort)(uStack_1024 * uStack_1034 + uStack_1044 * uStack_1054 +
                       uStack_1064 * uStack_1074) >> 8;
      uVar52 = (ushort)(uStack_1022 * uStack_1032 + uStack_1042 * uStack_1052 +
                       uStack_1062 * uStack_1072) >> 8;
      uVar55 = (ushort)((ushort)local_20f8 * (ushort)bVar1 + (ushort)bStack_20f7 * (ushort)bVar2 +
                       (ushort)bStack_20f6 * (ushort)bVar3) >> 8;
      uVar58 = (ushort)(uStack_101e * uStack_102e + uStack_103e * uStack_104e +
                       uStack_105e * uStack_106e) >> 8;
      uVar61 = (ushort)(uStack_101c * uStack_102c + uStack_103c * uStack_104c +
                       uStack_105c * uStack_106c) >> 8;
      uVar64 = (ushort)(uStack_101a * uStack_102a + uStack_103a * uStack_104a +
                       uStack_105a * uStack_106a) >> 8;
      uStack_a06 = (ushort)bStack_1aee;
      uStack_a04 = (ushort)bStack_20d6;
      uStack_a02 = (ushort)bStack_1b0e;
      uStack_9fe = (ushort)bStack_1b2e;
      uStack_9fc = (ushort)bStack_2116;
      uStack_9fa = (ushort)bStack_1b4e;
      uStack_a26 = (ushort)bStack_1af0;
      uStack_a24 = (ushort)local_20d8;
      uStack_a22 = (ushort)bStack_1b10;
      uStack_a1e = (ushort)bStack_1b30;
      uStack_a1c = (ushort)local_2118;
      uStack_a1a = (ushort)bStack_1b50;
      bVar1 = pRVar27->r_factor;
      uStack_1086 = (ushort)bStack_1aec;
      uStack_1084 = (ushort)bStack_20d4;
      uStack_1082 = (ushort)bStack_1b0c;
      uStack_107e = (ushort)bStack_1b2c;
      uStack_107c = (ushort)bStack_2114;
      uStack_107a = (ushort)bStack_1b4c;
      uStack_1096 = (ushort)bVar1;
      uStack_1094 = (ushort)bVar1;
      uStack_1092 = (ushort)bVar1;
      uStack_108e = (ushort)bVar1;
      uStack_108c = (ushort)bVar1;
      uStack_108a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].g_factor;
      uStack_10a6 = (ushort)bStack_1aeb;
      uStack_10a4 = (ushort)bStack_20d3;
      uStack_10a2 = (ushort)bStack_1b0b;
      uStack_109e = (ushort)bStack_1b2b;
      uStack_109c = (ushort)bStack_2113;
      uStack_109a = (ushort)bStack_1b4b;
      uStack_10b6 = (ushort)bVar2;
      uStack_10b4 = (ushort)bVar2;
      uStack_10b2 = (ushort)bVar2;
      uStack_10ae = (ushort)bVar2;
      uStack_10ac = (ushort)bVar2;
      uStack_10aa = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar28].b_factor;
      uStack_10c6 = (ushort)bStack_1aea;
      uStack_10c4 = (ushort)bStack_20d2;
      uStack_10c2 = (ushort)bStack_1b0a;
      uStack_10be = (ushort)bStack_1b2a;
      uStack_10bc = (ushort)bStack_2112;
      uStack_10ba = (ushort)bStack_1b4a;
      uStack_10d6 = (ushort)bVar3;
      uStack_10d4 = (ushort)bVar3;
      uStack_10d2 = (ushort)bVar3;
      uStack_10ce = (ushort)bVar3;
      uStack_10cc = (ushort)bVar3;
      uStack_10ca = (ushort)bVar3;
      uVar29 = (ushort)((ushort)bStack_20b4 * (ushort)bVar1 + (ushort)bStack_20b3 * (ushort)bVar2 +
                       (ushort)bStack_20b2 * (ushort)bVar3) >> 8;
      uVar32 = (ushort)(uStack_1086 * uStack_1096 + uStack_10a6 * uStack_10b6 +
                       uStack_10c6 * uStack_10d6) >> 8;
      uVar47 = (ushort)(uStack_1084 * uStack_1094 + uStack_10a4 * uStack_10b4 +
                       uStack_10c4 * uStack_10d4) >> 8;
      uVar48 = (ushort)(uStack_1082 * uStack_1092 + uStack_10a2 * uStack_10b2 +
                       uStack_10c2 * uStack_10d2) >> 8;
      uVar33 = (ushort)((ushort)bStack_20f4 * (ushort)bVar1 + (ushort)bStack_20f3 * (ushort)bVar2 +
                       (ushort)bStack_20f2 * (ushort)bVar3) >> 8;
      uVar36 = (ushort)(uStack_107e * uStack_108e + uStack_109e * uStack_10ae +
                       uStack_10be * uStack_10ce) >> 8;
      uVar37 = (ushort)(uStack_107c * uStack_108c + uStack_109c * uStack_10ac +
                       uStack_10bc * uStack_10cc) >> 8;
      uVar38 = (ushort)(uStack_107a * uStack_108a + uStack_109a * uStack_10aa +
                       uStack_10ba * uStack_10ca) >> 8;
      uStack_a46 = (ushort)bStack_1aea;
      uStack_a44 = (ushort)bStack_20d2;
      uStack_a42 = (ushort)bStack_1b0a;
      uStack_a3e = (ushort)bStack_1b2a;
      uStack_a3c = (ushort)bStack_2112;
      uStack_a3a = (ushort)bStack_1b4a;
      uStack_a66 = (ushort)bStack_1aec;
      uStack_a64 = (ushort)bStack_20d4;
      uStack_a62 = (ushort)bStack_1b0c;
      uStack_a5e = (ushort)bStack_1b2c;
      uStack_a5c = (ushort)bStack_2114;
      uStack_a5a = (ushort)bStack_1b4c;
      bVar1 = RGB2YUV[uVar28].y_factor;
      uStack_10f6 = (ushort)bVar1;
      uStack_10f4 = (ushort)bVar1;
      uStack_10f2 = (ushort)bVar1;
      uStack_10ee = (ushort)bVar1;
      uStack_10ec = (ushort)bVar1;
      uStack_10ea = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].y_offset;
      uStack_15f6 = (ushort)bVar2;
      uStack_15f4 = (ushort)bVar2;
      uStack_15f2 = (ushort)bVar2;
      uStack_15ee = (ushort)bVar2;
      uStack_15ec = (ushort)bVar2;
      uStack_15ea = (ushort)bVar2;
      uVar30 = ((ushort)(uVar41 * bVar1) >> 7) + (ushort)bVar2;
      uStack_15f6 = ((ushort)(uVar44 * uStack_10f6) >> 7) + uStack_15f6;
      uStack_15f4 = ((ushort)(uVar49 * uStack_10f4) >> 7) + uStack_15f4;
      uStack_15f2 = ((ushort)(uVar52 * uStack_10f2) >> 7) + uStack_15f2;
      uVar34 = ((ushort)(uVar55 * bVar1) >> 7) + (ushort)bVar2;
      uStack_15ee = ((ushort)(uVar58 * uStack_10ee) >> 7) + uStack_15ee;
      uStack_15ec = ((ushort)(uVar61 * uStack_10ec) >> 7) + uStack_15ec;
      uStack_15ea = ((ushort)(uVar64 * uStack_10ea) >> 7) + uStack_15ea;
      bVar1 = RGB2YUV[uVar28].y_factor;
      uStack_1116 = (ushort)bVar1;
      uStack_1114 = (ushort)bVar1;
      uStack_1112 = (ushort)bVar1;
      uStack_110e = (ushort)bVar1;
      uStack_110c = (ushort)bVar1;
      uStack_110a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].y_offset;
      uStack_1616 = (ushort)bVar2;
      uStack_1614 = (ushort)bVar2;
      uStack_1612 = (ushort)bVar2;
      uStack_160e = (ushort)bVar2;
      uStack_160c = (ushort)bVar2;
      uStack_160a = (ushort)bVar2;
      uVar31 = ((ushort)(uVar29 * bVar1) >> 7) + (ushort)bVar2;
      uStack_1616 = ((ushort)(uVar32 * uStack_1116) >> 7) + uStack_1616;
      uStack_1614 = ((ushort)(uVar47 * uStack_1114) >> 7) + uStack_1614;
      uStack_1612 = ((ushort)(uVar48 * uStack_1112) >> 7) + uStack_1612;
      uVar35 = ((ushort)(uVar33 * bVar1) >> 7) + (ushort)bVar2;
      uStack_160e = ((ushort)(uVar36 * uStack_110e) >> 7) + uStack_160e;
      uStack_160c = ((ushort)(uVar37 * uStack_110c) >> 7) + uStack_160c;
      uStack_160a = ((ushort)(uVar38 * uStack_110a) >> 7) + uStack_160a;
      *(ulong *)(u_ptr + 0x10) =
           CONCAT17((uStack_1612 != 0) * (uStack_1612 < 0x100) * (char)uStack_1612 -
                    (0xff < uStack_1612),
                    CONCAT16((uStack_15f2 != 0) * (uStack_15f2 < 0x100) * (char)uStack_15f2 -
                             (0xff < uStack_15f2),
                             CONCAT15((uStack_1614 != 0) * (uStack_1614 < 0x100) * (char)uStack_1614
                                      - (0xff < uStack_1614),
                                      CONCAT14((uStack_15f4 != 0) * (uStack_15f4 < 0x100) *
                                               (char)uStack_15f4 - (0xff < uStack_15f4),
                                               CONCAT13((uStack_1616 != 0) * (uStack_1616 < 0x100) *
                                                        (char)uStack_1616 - (0xff < uStack_1616),
                                                        CONCAT12((uStack_15f6 != 0) *
                                                                 (uStack_15f6 < 0x100) *
                                                                 (char)uStack_15f6 -
                                                                 (0xff < uStack_15f6),
                                                                 CONCAT11((uVar31 != 0) *
                                                                          (uVar31 < 0x100) *
                                                                          (char)uVar31 -
                                                                          (0xff < uVar31),
                                                                          (uVar30 != 0) *
                                                                          (uVar30 < 0x100) *
                                                                          (char)uVar30 -
                                                                          (0xff < uVar30))))))));
      *(ulong *)(u_ptr + 0x18) =
           CONCAT17((uStack_160a != 0) * (uStack_160a < 0x100) * (char)uStack_160a -
                    (0xff < uStack_160a),
                    CONCAT16((uStack_15ea != 0) * (uStack_15ea < 0x100) * (char)uStack_15ea -
                             (0xff < uStack_15ea),
                             CONCAT15((uStack_160c != 0) * (uStack_160c < 0x100) * (char)uStack_160c
                                      - (0xff < uStack_160c),
                                      CONCAT14((uStack_15ec != 0) * (uStack_15ec < 0x100) *
                                               (char)uStack_15ec - (0xff < uStack_15ec),
                                               CONCAT13((uStack_160e != 0) * (uStack_160e < 0x100) *
                                                        (char)uStack_160e - (0xff < uStack_160e),
                                                        CONCAT12((uStack_15ee != 0) *
                                                                 (uStack_15ee < 0x100) *
                                                                 (char)uStack_15ee -
                                                                 (0xff < uStack_15ee),
                                                                 CONCAT11((uVar35 != 0) *
                                                                          (uVar35 < 0x100) *
                                                                          (char)uVar35 -
                                                                          (0xff < uVar35),
                                                                          (uVar34 != 0) *
                                                                          (uVar34 < 0x100) *
                                                                          (char)uVar34 -
                                                                          (0xff < uVar34))))))));
      auVar22._2_2_ =
           (uStack_986 - uVar42) + (uStack_9c6 - uVar43) + (uStack_a06 - uVar44) +
           (uStack_a46 - uVar32);
      auVar22._0_2_ =
           (bStack_20a6 - uVar39) + (bStack_20a2 - uVar40) + (bStack_20b6 - uVar41) +
           (bStack_20b2 - uVar29);
      auVar22._4_2_ =
           (uStack_984 - uVar45) + (uStack_9c4 - uVar46) + (uStack_a04 - uVar49) +
           (uStack_a44 - uVar47);
      auVar22._6_2_ =
           (uStack_982 - uVar50) + (uStack_9c2 - uVar51) + (uStack_a02 - uVar52) +
           (uStack_a42 - uVar48);
      auVar22._10_2_ =
           (uStack_97e - uVar56) + (uStack_9be - uVar57) + (uStack_9fe - uVar58) +
           (uStack_a3e - uVar36);
      auVar22._8_2_ =
           (bStack_20e6 - uVar53) + (bStack_20e2 - uVar54) + (bStack_20f6 - uVar55) +
           (bStack_20f2 - uVar33);
      auVar22._12_2_ =
           (uStack_97c - uVar59) + (uStack_9bc - uVar60) + (uStack_9fc - uVar61) +
           (uStack_a3c - uVar37);
      auVar22._14_2_ =
           (uStack_97a - uVar62) + (uStack_9ba - uVar63) + (uStack_9fa - uVar64) +
           (uStack_a3a - uVar38);
      auVar65 = psraw(auVar22,ZEXT416(2));
      bVar1 = RGB2YUV[uVar28].cb_factor;
      local_1128 = auVar65._0_2_;
      sStack_1126 = auVar65._2_2_;
      sStack_1124 = auVar65._4_2_;
      sStack_1122 = auVar65._6_2_;
      sStack_1120 = auVar65._8_2_;
      sStack_111e = auVar65._10_2_;
      sStack_111c = auVar65._12_2_;
      sStack_111a = auVar65._14_2_;
      uStack_1136 = (ushort)bVar1;
      uStack_1134 = (ushort)bVar1;
      uStack_1132 = (ushort)bVar1;
      uStack_112e = (ushort)bVar1;
      uStack_112c = (ushort)bVar1;
      uStack_112a = (ushort)bVar1;
      auVar21._2_2_ = sStack_1126 * uStack_1136;
      auVar21._0_2_ = local_1128 * (ushort)bVar1;
      auVar21._4_2_ = sStack_1124 * uStack_1134;
      auVar21._6_2_ = sStack_1122 * uStack_1132;
      auVar21._8_2_ = sStack_1120 * (ushort)bVar1;
      auVar21._10_2_ = sStack_111e * uStack_112e;
      auVar21._12_2_ = sStack_111c * uStack_112c;
      auVar21._14_2_ = sStack_111a * uStack_112a;
      auVar65 = psraw(auVar21,ZEXT416(8));
      local_1628 = auVar65._0_2_;
      sStack_1626 = auVar65._2_2_;
      sStack_1624 = auVar65._4_2_;
      sStack_1622 = auVar65._6_2_;
      sStack_1620 = auVar65._8_2_;
      sStack_161e = auVar65._10_2_;
      sStack_161c = auVar65._12_2_;
      sStack_161a = auVar65._14_2_;
      local_1628 = local_1628 + 0x80;
      sStack_1626 = sStack_1626 + 0x80;
      sStack_1624 = sStack_1624 + 0x80;
      sStack_1622 = sStack_1622 + 0x80;
      sStack_1620 = sStack_1620 + 0x80;
      sStack_161e = sStack_161e + 0x80;
      sStack_161c = sStack_161c + 0x80;
      sStack_161a = sStack_161a + 0x80;
      auVar20._2_2_ =
           (uStack_9a6 - uVar42) + (uStack_9e6 - uVar43) + (uStack_a26 - uVar44) +
           (uStack_a66 - uVar32);
      auVar20._0_2_ =
           (local_20a8 - uVar39) + (bStack_20a4 - uVar40) + (local_20b8 - uVar41) +
           (bStack_20b4 - uVar29);
      auVar20._4_2_ =
           (uStack_9a4 - uVar45) + (uStack_9e4 - uVar46) + (uStack_a24 - uVar49) +
           (uStack_a64 - uVar47);
      auVar20._6_2_ =
           (uStack_9a2 - uVar50) + (uStack_9e2 - uVar51) + (uStack_a22 - uVar52) +
           (uStack_a62 - uVar48);
      auVar20._10_2_ =
           (uStack_99e - uVar56) + (uStack_9de - uVar57) + (uStack_a1e - uVar58) +
           (uStack_a5e - uVar36);
      auVar20._8_2_ =
           (local_20e8 - uVar53) + (bStack_20e4 - uVar54) + (local_20f8 - uVar55) +
           (bStack_20f4 - uVar33);
      auVar20._12_2_ =
           (uStack_99c - uVar59) + (uStack_9dc - uVar60) + (uStack_a1c - uVar61) +
           (uStack_a5c - uVar37);
      auVar20._14_2_ =
           (uStack_99a - uVar62) + (uStack_9da - uVar63) + (uStack_a1a - uVar64) +
           (uStack_a5a - uVar38);
      auVar65 = psraw(auVar20,ZEXT416(2));
      bVar1 = RGB2YUV[uVar28].cr_factor;
      local_1148 = auVar65._0_2_;
      sStack_1146 = auVar65._2_2_;
      sStack_1144 = auVar65._4_2_;
      sStack_1142 = auVar65._6_2_;
      sStack_1140 = auVar65._8_2_;
      sStack_113e = auVar65._10_2_;
      sStack_113c = auVar65._12_2_;
      sStack_113a = auVar65._14_2_;
      uStack_1156 = (ushort)bVar1;
      uStack_1154 = (ushort)bVar1;
      uStack_1152 = (ushort)bVar1;
      uStack_114e = (ushort)bVar1;
      uStack_114c = (ushort)bVar1;
      uStack_114a = (ushort)bVar1;
      auVar65._2_2_ = sStack_1146 * uStack_1156;
      auVar65._0_2_ = local_1148 * (ushort)bVar1;
      auVar65._4_2_ = sStack_1144 * uStack_1154;
      auVar65._6_2_ = sStack_1142 * uStack_1152;
      auVar65._8_2_ = sStack_1140 * (ushort)bVar1;
      auVar65._10_2_ = sStack_113e * uStack_114e;
      auVar65._12_2_ = sStack_113c * uStack_114c;
      auVar65._14_2_ = sStack_113a * uStack_114a;
      auVar65 = psraw(auVar65,ZEXT416(8));
      local_1648 = auVar65._0_2_;
      sStack_1646 = auVar65._2_2_;
      sStack_1644 = auVar65._4_2_;
      sStack_1642 = auVar65._6_2_;
      sStack_1640 = auVar65._8_2_;
      sStack_163e = auVar65._10_2_;
      sStack_163c = auVar65._12_2_;
      sStack_163a = auVar65._14_2_;
      local_1648 = local_1648 + 0x80;
      sStack_1646 = sStack_1646 + 0x80;
      sStack_1644 = sStack_1644 + 0x80;
      sStack_1642 = sStack_1642 + 0x80;
      sStack_1640 = sStack_1640 + 0x80;
      sStack_163e = sStack_163e + 0x80;
      sStack_163c = sStack_163c + 0x80;
      sStack_163a = sStack_163a + 0x80;
      *(ulong *)v_ptr =
           CONCAT17((0 < sStack_139a) * (sStack_139a < 0x100) * (char)sStack_139a -
                    (0xff < sStack_139a),
                    CONCAT16((0 < sStack_139c) * (sStack_139c < 0x100) * (char)sStack_139c -
                             (0xff < sStack_139c),
                             CONCAT15((0 < sStack_139e) * (sStack_139e < 0x100) * (char)sStack_139e
                                      - (0xff < sStack_139e),
                                      CONCAT14((0 < sStack_13a0) * (sStack_13a0 < 0x100) *
                                               (char)sStack_13a0 - (0xff < sStack_13a0),
                                               CONCAT13((0 < sStack_13a2) * (sStack_13a2 < 0x100) *
                                                        (char)sStack_13a2 - (0xff < sStack_13a2),
                                                        CONCAT12((0 < sStack_13a4) *
                                                                 (sStack_13a4 < 0x100) *
                                                                 (char)sStack_13a4 -
                                                                 (0xff < sStack_13a4),
                                                                 CONCAT11((0 < sStack_13a6) *
                                                                          (sStack_13a6 < 0x100) *
                                                                          (char)sStack_13a6 -
                                                                          (0xff < sStack_13a6),
                                                                          (0 < local_13a8) *
                                                                          (local_13a8 < 0x100) *
                                                                          (char)local_13a8 -
                                                                          (0xff < local_13a8))))))))
      ;
      *(ulong *)(v_ptr + 8) =
           CONCAT17((0 < sStack_161a) * (sStack_161a < 0x100) * (char)sStack_161a -
                    (0xff < sStack_161a),
                    CONCAT16((0 < sStack_161c) * (sStack_161c < 0x100) * (char)sStack_161c -
                             (0xff < sStack_161c),
                             CONCAT15((0 < sStack_161e) * (sStack_161e < 0x100) * (char)sStack_161e
                                      - (0xff < sStack_161e),
                                      CONCAT14((0 < sStack_1620) * (sStack_1620 < 0x100) *
                                               (char)sStack_1620 - (0xff < sStack_1620),
                                               CONCAT13((0 < sStack_1622) * (sStack_1622 < 0x100) *
                                                        (char)sStack_1622 - (0xff < sStack_1622),
                                                        CONCAT12((0 < sStack_1624) *
                                                                 (sStack_1624 < 0x100) *
                                                                 (char)sStack_1624 -
                                                                 (0xff < sStack_1624),
                                                                 CONCAT11((0 < sStack_1626) *
                                                                          (sStack_1626 < 0x100) *
                                                                          (char)sStack_1626 -
                                                                          (0xff < sStack_1626),
                                                                          (0 < local_1628) *
                                                                          (local_1628 < 0x100) *
                                                                          (char)local_1628 -
                                                                          (0xff < local_1628))))))))
      ;
      *(ulong *)local_2440 =
           CONCAT17((0 < sStack_13ba) * (sStack_13ba < 0x100) * (char)sStack_13ba -
                    (0xff < sStack_13ba),
                    CONCAT16((0 < sStack_13bc) * (sStack_13bc < 0x100) * (char)sStack_13bc -
                             (0xff < sStack_13bc),
                             CONCAT15((0 < sStack_13be) * (sStack_13be < 0x100) * (char)sStack_13be
                                      - (0xff < sStack_13be),
                                      CONCAT14((0 < sStack_13c0) * (sStack_13c0 < 0x100) *
                                               (char)sStack_13c0 - (0xff < sStack_13c0),
                                               CONCAT13((0 < sStack_13c2) * (sStack_13c2 < 0x100) *
                                                        (char)sStack_13c2 - (0xff < sStack_13c2),
                                                        CONCAT12((0 < sStack_13c4) *
                                                                 (sStack_13c4 < 0x100) *
                                                                 (char)sStack_13c4 -
                                                                 (0xff < sStack_13c4),
                                                                 CONCAT11((0 < sStack_13c6) *
                                                                          (sStack_13c6 < 0x100) *
                                                                          (char)sStack_13c6 -
                                                                          (0xff < sStack_13c6),
                                                                          (0 < local_13c8) *
                                                                          (local_13c8 < 0x100) *
                                                                          (char)local_13c8 -
                                                                          (0xff < local_13c8))))))))
      ;
      *(ulong *)(local_2440 + 8) =
           CONCAT17((0 < sStack_163a) * (sStack_163a < 0x100) * (char)sStack_163a -
                    (0xff < sStack_163a),
                    CONCAT16((0 < sStack_163c) * (sStack_163c < 0x100) * (char)sStack_163c -
                             (0xff < sStack_163c),
                             CONCAT15((0 < sStack_163e) * (sStack_163e < 0x100) * (char)sStack_163e
                                      - (0xff < sStack_163e),
                                      CONCAT14((0 < sStack_1640) * (sStack_1640 < 0x100) *
                                               (char)sStack_1640 - (0xff < sStack_1640),
                                               CONCAT13((0 < sStack_1642) * (sStack_1642 < 0x100) *
                                                        (char)sStack_1642 - (0xff < sStack_1642),
                                                        CONCAT12((0 < sStack_1644) *
                                                                 (sStack_1644 < 0x100) *
                                                                 (char)sStack_1644 -
                                                                 (0xff < sStack_1644),
                                                                 CONCAT11((0 < sStack_1646) *
                                                                          (sStack_1646 < 0x100) *
                                                                          (char)sStack_1646 -
                                                                          (0xff < sStack_1646),
                                                                          (0 < local_1648) *
                                                                          (local_1648 < 0x100) *
                                                                          (char)local_1648 -
                                                                          (0xff < local_1648))))))))
      ;
      rgb_ptr2 = rgb_ptr2 + 0x80;
      y_ptr1 = y_ptr1 + 0x80;
      y_ptr2 = y_ptr2 + 0x20;
      u_ptr = u_ptr + 0x20;
      v_ptr = v_ptr + 0x10;
      local_2440 = local_2440 + 0x10;
    }
  }
  return;
}

Assistant:

void rgb32_yuv420_sse(uint32_t width, uint32_t height, 
	const uint8_t *RGBA, uint32_t RGBA_stride, 
	uint8_t *Y, uint8_t *U, uint8_t *V, uint32_t Y_stride, uint32_t UV_stride, 
	YCbCrType yuv_type)
{
	#define LOAD_SI128 _mm_load_si128
	#define SAVE_SI128 _mm_stream_si128
	const RGB2YUVParam *const param = &(RGB2YUV[yuv_type]);
	
	uint32_t x, y;
	for(y=0; y<(height-1); y+=2)
	{
		const uint8_t *rgb_ptr1=RGBA+y*RGBA_stride,
			*rgb_ptr2=RGBA+(y+1)*RGBA_stride;
		
		uint8_t *y_ptr1=Y+y*Y_stride,
			*y_ptr2=Y+(y+1)*Y_stride,
			*u_ptr=U+(y/2)*UV_stride,
			*v_ptr=V+(y/2)*UV_stride;
		
		for(x=0; x<(width-31); x+=32)
		{
			RGBA2YUV_32
			
			rgb_ptr1+=128;
			rgb_ptr2+=128;
			y_ptr1+=32;
			y_ptr2+=32;
			u_ptr+=16; 
			v_ptr+=16;
		}
	}
	#undef LOAD_SI128
	#undef SAVE_SI128
}